

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx2::CurveNiMBIntersectorK<4,8>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [16];
  float *pfVar4;
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  uint uVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [12];
  uint uVar57;
  int iVar58;
  uint uVar59;
  ulong uVar60;
  ulong uVar61;
  long lVar62;
  byte bVar63;
  uint uVar64;
  uint uVar65;
  long lVar66;
  uint uVar67;
  float fVar68;
  float fVar69;
  undefined4 uVar70;
  float fVar103;
  float fVar104;
  vint4 bi_2;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar105;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined8 uVar106;
  vint4 bi_1;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  vint4 bi;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar145;
  float fVar167;
  float fVar168;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar169;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar146;
  undefined1 auVar154 [16];
  float fVar147;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  vint4 ai_2;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  vint4 ai_1;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  vint4 ai;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  float fVar222;
  float fVar238;
  float fVar240;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar242;
  float fVar243;
  float fVar244;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar239;
  float fVar241;
  undefined1 auVar237 [32];
  float fVar245;
  float fVar261;
  float fVar262;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar263;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar253 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  float fVar264;
  float fVar277;
  __m128 a;
  undefined1 auVar301 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [32];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [64];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [32];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar324 [16];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  float fVar330;
  float fVar338;
  float fVar339;
  undefined1 auVar331 [16];
  float fVar340;
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar337 [32];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p03;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float local_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined1 local_6a0 [8];
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  float local_680;
  float fStack_67c;
  float fStack_678;
  undefined1 local_650 [8];
  float fStack_648;
  float fStack_644;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float local_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  uint local_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  RTCFilterFunctionNArguments local_540;
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  uint auStack_4b0 [4];
  undefined1 local_4a0 [32];
  undefined1 local_470 [16];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  uint uStack_360;
  float afStack_35c [7];
  undefined1 local_340 [32];
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  uint local_300;
  uint uStack_2fc;
  uint uStack_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint uStack_2e8;
  uint uStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  float fVar221;
  undefined1 auVar336 [32];
  
  PVar7 = prim[1];
  uVar60 = (ulong)(byte)PVar7;
  lVar62 = uVar60 * 0x25;
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar68 = *(float *)(prim + lVar62 + 0x12);
  auVar16 = vsubps_avx(auVar16,*(undefined1 (*) [16])(prim + lVar62 + 6));
  auVar71._0_4_ = fVar68 * auVar16._0_4_;
  auVar71._4_4_ = fVar68 * auVar16._4_4_;
  auVar71._8_4_ = fVar68 * auVar16._8_4_;
  auVar71._12_4_ = fVar68 * auVar16._12_4_;
  auVar132._0_4_ = fVar68 * auVar17._0_4_;
  auVar132._4_4_ = fVar68 * auVar17._4_4_;
  auVar132._8_4_ = fVar68 * auVar17._8_4_;
  auVar132._12_4_ = fVar68 * auVar17._12_4_;
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar160 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xf + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar188 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar60 + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1a + 6)));
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1b + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar115 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1c + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar320._4_4_ = auVar132._0_4_;
  auVar320._0_4_ = auVar132._0_4_;
  auVar320._8_4_ = auVar132._0_4_;
  auVar320._12_4_ = auVar132._0_4_;
  auVar23 = vshufps_avx(auVar132,auVar132,0x55);
  auVar135 = vshufps_avx(auVar132,auVar132,0xaa);
  fVar68 = auVar135._0_4_;
  auVar278._0_4_ = fVar68 * auVar160._0_4_;
  fVar103 = auVar135._4_4_;
  auVar278._4_4_ = fVar103 * auVar160._4_4_;
  fVar104 = auVar135._8_4_;
  auVar278._8_4_ = fVar104 * auVar160._8_4_;
  fVar147 = auVar135._12_4_;
  auVar278._12_4_ = fVar147 * auVar160._12_4_;
  auVar265._0_4_ = auVar188._0_4_ * fVar68;
  auVar265._4_4_ = auVar188._4_4_ * fVar103;
  auVar265._8_4_ = auVar188._8_4_ * fVar104;
  auVar265._12_4_ = auVar188._12_4_ * fVar147;
  auVar246._0_4_ = auVar115._0_4_ * fVar68;
  auVar246._4_4_ = auVar115._4_4_ * fVar103;
  auVar246._8_4_ = auVar115._8_4_ * fVar104;
  auVar246._12_4_ = auVar115._12_4_ * fVar147;
  auVar135 = vfmadd231ps_fma(auVar278,auVar23,auVar17);
  auVar150 = vfmadd231ps_fma(auVar265,auVar23,auVar20);
  auVar23 = vfmadd231ps_fma(auVar246,auVar22,auVar23);
  auVar72 = vfmadd231ps_fma(auVar135,auVar320,auVar16);
  auVar150 = vfmadd231ps_fma(auVar150,auVar320,auVar19);
  auVar73 = vfmadd231ps_fma(auVar23,auVar21,auVar320);
  auVar321._4_4_ = auVar71._0_4_;
  auVar321._0_4_ = auVar71._0_4_;
  auVar321._8_4_ = auVar71._0_4_;
  auVar321._12_4_ = auVar71._0_4_;
  auVar23 = vshufps_avx(auVar71,auVar71,0x55);
  auVar135 = vshufps_avx(auVar71,auVar71,0xaa);
  fVar68 = auVar135._0_4_;
  auVar133._0_4_ = fVar68 * auVar160._0_4_;
  fVar103 = auVar135._4_4_;
  auVar133._4_4_ = fVar103 * auVar160._4_4_;
  fVar104 = auVar135._8_4_;
  auVar133._8_4_ = fVar104 * auVar160._8_4_;
  fVar147 = auVar135._12_4_;
  auVar133._12_4_ = fVar147 * auVar160._12_4_;
  auVar107._0_4_ = auVar188._0_4_ * fVar68;
  auVar107._4_4_ = auVar188._4_4_ * fVar103;
  auVar107._8_4_ = auVar188._8_4_ * fVar104;
  auVar107._12_4_ = auVar188._12_4_ * fVar147;
  auVar301._0_4_ = auVar115._0_4_ * fVar68;
  auVar301._4_4_ = auVar115._4_4_ * fVar103;
  auVar301._8_4_ = auVar115._8_4_ * fVar104;
  auVar301._12_4_ = auVar115._12_4_ * fVar147;
  auVar17 = vfmadd231ps_fma(auVar133,auVar23,auVar17);
  auVar160 = vfmadd231ps_fma(auVar107,auVar23,auVar20);
  auVar20 = vfmadd231ps_fma(auVar301,auVar23,auVar22);
  auVar107 = vfmadd231ps_fma(auVar17,auVar321,auVar16);
  auVar108 = vfmadd231ps_fma(auVar160,auVar321,auVar19);
  local_4c0._8_4_ = 0x7fffffff;
  local_4c0._0_8_ = 0x7fffffff7fffffff;
  local_4c0._12_4_ = 0x7fffffff;
  auVar16 = vandps_avx(auVar72,local_4c0);
  auVar223._8_4_ = 0x219392ef;
  auVar223._0_8_ = 0x219392ef219392ef;
  auVar223._12_4_ = 0x219392ef;
  auVar16 = vcmpps_avx(auVar16,auVar223,1);
  auVar17 = vblendvps_avx(auVar72,auVar223,auVar16);
  auVar16 = vandps_avx(auVar150,local_4c0);
  auVar16 = vcmpps_avx(auVar16,auVar223,1);
  auVar160 = vblendvps_avx(auVar150,auVar223,auVar16);
  auVar16 = vandps_avx(auVar73,local_4c0);
  auVar16 = vcmpps_avx(auVar16,auVar223,1);
  auVar16 = vblendvps_avx(auVar73,auVar223,auVar16);
  auVar109 = vfmadd231ps_fma(auVar20,auVar321,auVar21);
  auVar19 = vrcpps_avx(auVar17);
  auVar224._8_4_ = 0x3f800000;
  auVar224._0_8_ = 0x3f8000003f800000;
  auVar224._12_4_ = 0x3f800000;
  auVar17 = vfnmadd213ps_fma(auVar17,auVar19,auVar224);
  auVar72 = vfmadd132ps_fma(auVar17,auVar19,auVar19);
  auVar17 = vrcpps_avx(auVar160);
  auVar160 = vfnmadd213ps_fma(auVar160,auVar17,auVar224);
  auVar73 = vfmadd132ps_fma(auVar160,auVar17,auVar17);
  auVar17 = vrcpps_avx(auVar16);
  auVar16 = vfnmadd213ps_fma(auVar16,auVar17,auVar224);
  auVar71 = vfmadd132ps_fma(auVar16,auVar17,auVar17);
  fVar68 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar62 + 0x16)) *
           *(float *)(prim + lVar62 + 0x1a);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  auVar202._4_4_ = fVar68;
  auVar202._0_4_ = fVar68;
  auVar202._8_4_ = fVar68;
  auVar202._12_4_ = fVar68;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar60 * 0xb + 6);
  auVar17 = vpmovsxwd_avx(auVar17);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar16);
  auVar301 = vfmadd213ps_fma(auVar17,auVar202,auVar16);
  auVar160._8_8_ = 0;
  auVar160._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar16 = vpmovsxwd_avx(auVar160);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar60 * 0xd + 6);
  auVar17 = vpmovsxwd_avx(auVar19);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar16);
  auVar160 = vfmadd213ps_fma(auVar17,auVar202,auVar16);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar60 * 0x12 + 6);
  auVar16 = vpmovsxwd_avx(auVar20);
  uVar61 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  auVar188._8_8_ = 0;
  auVar188._0_8_ = *(ulong *)(prim + uVar60 * 2 + uVar61 + 6);
  auVar17 = vpmovsxwd_avx(auVar188);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar16);
  auVar19 = vfmadd213ps_fma(auVar17,auVar202,auVar16);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar61 + 6);
  auVar16 = vpmovsxwd_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar60 * 0x18 + 6);
  auVar17 = vpmovsxwd_avx(auVar22);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar16);
  auVar20 = vfmadd213ps_fma(auVar17,auVar202,auVar16);
  auVar115._8_8_ = 0;
  auVar115._0_8_ = *(ulong *)(prim + uVar60 * 0x1d + 6);
  auVar16 = vpmovsxwd_avx(auVar115);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar60 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar17 = vpmovsxwd_avx(auVar23);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar16);
  auVar188 = vfmadd213ps_fma(auVar17,auVar202,auVar16);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar60) + 6);
  auVar16 = vpmovsxwd_avx(auVar135);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + uVar60 * 0x23 + 6);
  auVar17 = vpmovsxwd_avx(auVar150);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar16);
  auVar17 = vfmadd213ps_fma(auVar17,auVar202,auVar16);
  auVar16 = vsubps_avx(auVar301,auVar107);
  auVar190._0_4_ = auVar72._0_4_ * auVar16._0_4_;
  auVar190._4_4_ = auVar72._4_4_ * auVar16._4_4_;
  auVar190._8_4_ = auVar72._8_4_ * auVar16._8_4_;
  auVar190._12_4_ = auVar72._12_4_ * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar160,auVar107);
  auVar293._0_4_ = auVar72._0_4_ * auVar16._0_4_;
  auVar293._4_4_ = auVar72._4_4_ * auVar16._4_4_;
  auVar293._8_4_ = auVar72._8_4_ * auVar16._8_4_;
  auVar293._12_4_ = auVar72._12_4_ * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar19,auVar108);
  auVar157._0_4_ = auVar73._0_4_ * auVar16._0_4_;
  auVar157._4_4_ = auVar73._4_4_ * auVar16._4_4_;
  auVar157._8_4_ = auVar73._8_4_ * auVar16._8_4_;
  auVar157._12_4_ = auVar73._12_4_ * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar20,auVar108);
  auVar108._0_4_ = auVar73._0_4_ * auVar16._0_4_;
  auVar108._4_4_ = auVar73._4_4_ * auVar16._4_4_;
  auVar108._8_4_ = auVar73._8_4_ * auVar16._8_4_;
  auVar108._12_4_ = auVar73._12_4_ * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar188,auVar109);
  auVar170._0_4_ = auVar71._0_4_ * auVar16._0_4_;
  auVar170._4_4_ = auVar71._4_4_ * auVar16._4_4_;
  auVar170._8_4_ = auVar71._8_4_ * auVar16._8_4_;
  auVar170._12_4_ = auVar71._12_4_ * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar17,auVar109);
  auVar72._0_4_ = auVar71._0_4_ * auVar16._0_4_;
  auVar72._4_4_ = auVar71._4_4_ * auVar16._4_4_;
  auVar72._8_4_ = auVar71._8_4_ * auVar16._8_4_;
  auVar72._12_4_ = auVar71._12_4_ * auVar16._12_4_;
  auVar16 = vpminsd_avx(auVar190,auVar293);
  auVar17 = vpminsd_avx(auVar157,auVar108);
  auVar16 = vmaxps_avx(auVar16,auVar17);
  auVar17 = vpminsd_avx(auVar170,auVar72);
  uVar70 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar247._4_4_ = uVar70;
  auVar247._0_4_ = uVar70;
  auVar247._8_4_ = uVar70;
  auVar247._12_4_ = uVar70;
  auVar17 = vmaxps_avx(auVar17,auVar247);
  auVar16 = vmaxps_avx(auVar16,auVar17);
  local_470._0_4_ = auVar16._0_4_ * 0.99999964;
  local_470._4_4_ = auVar16._4_4_ * 0.99999964;
  local_470._8_4_ = auVar16._8_4_ * 0.99999964;
  local_470._12_4_ = auVar16._12_4_ * 0.99999964;
  auVar16 = vpmaxsd_avx(auVar190,auVar293);
  auVar17 = vpmaxsd_avx(auVar157,auVar108);
  auVar16 = vminps_avx(auVar16,auVar17);
  auVar17 = vpmaxsd_avx(auVar170,auVar72);
  uVar70 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar134._4_4_ = uVar70;
  auVar134._0_4_ = uVar70;
  auVar134._8_4_ = uVar70;
  auVar134._12_4_ = uVar70;
  auVar17 = vminps_avx(auVar17,auVar134);
  auVar16 = vminps_avx(auVar16,auVar17);
  auVar73._0_4_ = auVar16._0_4_ * 1.0000004;
  auVar73._4_4_ = auVar16._4_4_ * 1.0000004;
  auVar73._8_4_ = auVar16._8_4_ * 1.0000004;
  auVar73._12_4_ = auVar16._12_4_ * 1.0000004;
  auVar109._1_3_ = 0;
  auVar109[0] = PVar7;
  auVar109[4] = PVar7;
  auVar109._5_3_ = 0;
  auVar109[8] = PVar7;
  auVar109._9_3_ = 0;
  auVar109[0xc] = PVar7;
  auVar109._13_3_ = 0;
  auVar17 = vpcmpgtd_avx(auVar109,_DAT_01f7fcf0);
  auVar16 = vcmpps_avx(local_470,auVar73,2);
  auVar16 = vandps_avx(auVar16,auVar17);
  uVar57 = vmovmskps_avx(auVar16);
  if (uVar57 == 0) {
    return;
  }
  uVar57 = uVar57 & 0xff;
  auVar98._16_16_ = mm_lookupmask_ps._240_16_;
  auVar98._0_16_ = mm_lookupmask_ps._240_16_;
  local_2e0 = vblendps_avx(auVar98,ZEXT832(0) << 0x20,0x80);
  iVar58 = 1 << ((uint)k & 0x1f);
  auVar99._4_4_ = iVar58;
  auVar99._0_4_ = iVar58;
  auVar99._8_4_ = iVar58;
  auVar99._12_4_ = iVar58;
  auVar99._16_4_ = iVar58;
  auVar99._20_4_ = iVar58;
  auVar99._24_4_ = iVar58;
  auVar99._28_4_ = iVar58;
  auVar25 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar98 = vpand_avx2(auVar99,auVar25);
  local_340 = vpcmpeqd_avx2(auVar98,auVar25);
  do {
    lVar62 = 0;
    for (uVar60 = (ulong)uVar57; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
      lVar62 = lVar62 + 1;
    }
    uVar59 = *(uint *)(prim + 2);
    uVar8 = *(uint *)(prim + lVar62 * 4 + 6);
    pGVar9 = (context->scene->geometries).items[uVar59].ptr;
    fVar68 = (pGVar9->time_range).lower;
    fVar104 = pGVar9->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar68) / ((pGVar9->time_range).upper - fVar68));
    auVar16 = vroundss_avx(ZEXT416((uint)fVar104),ZEXT416((uint)fVar104),9);
    auVar16 = vminss_avx(auVar16,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
    auVar23 = vmaxss_avx(ZEXT816(0),auVar16);
    uVar60 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                             (ulong)uVar8 *
                             pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar66 = (long)(int)auVar23._0_4_ * 0x38;
    lVar11 = *(long *)(_Var10 + lVar66);
    lVar12 = *(long *)(_Var10 + 0x10 + lVar66);
    auVar16 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar60);
    lVar62 = uVar60 + 1;
    auVar17 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar62);
    lVar1 = uVar60 + 2;
    auVar160 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
    lVar2 = uVar60 + 3;
    pauVar3 = (undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
    auVar170 = *pauVar3;
    lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
    lVar12 = *(long *)(lVar11 + lVar66);
    lVar13 = *(long *)(lVar11 + 0x10 + lVar66);
    auVar19 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar60);
    auVar20 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar62);
    auVar188 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
    pfVar4 = (float *)(lVar12 + lVar13 * lVar2);
    fVar68 = *pfVar4;
    fVar103 = pfVar4[1];
    fVar147 = pfVar4[2];
    fVar69 = pfVar4[3];
    auVar310._0_4_ = *(float *)*pauVar3 * 0.0;
    auVar310._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
    auVar310._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
    auVar310._12_4_ = *(float *)(*pauVar3 + 0xc) * 0.0;
    auVar298._8_4_ = 0x3f000000;
    auVar298._0_8_ = 0x3f0000003f000000;
    auVar298._12_4_ = 0x3f000000;
    auVar21 = vfmadd231ps_fma(auVar310,auVar160,auVar298);
    auVar21 = vfmadd231ps_fma(auVar21,auVar17,ZEXT816(0) << 0x40);
    auVar293 = vfnmadd231ps_fma(auVar21,auVar16,auVar298);
    auVar203._8_4_ = 0x80000000;
    auVar203._0_8_ = 0x8000000080000000;
    auVar203._12_4_ = 0x80000000;
    auVar248._0_4_ = fVar68 * -0.0;
    auVar248._4_4_ = fVar103 * -0.0;
    auVar248._8_4_ = fVar147 * -0.0;
    auVar248._12_4_ = fVar69 * -0.0;
    auVar21 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar188,auVar248);
    auVar225._0_4_ = auVar20._0_4_ + auVar21._0_4_;
    auVar225._4_4_ = auVar20._4_4_ + auVar21._4_4_;
    auVar225._8_4_ = auVar20._8_4_ + auVar21._8_4_;
    auVar225._12_4_ = auVar20._12_4_ + auVar21._12_4_;
    auVar21 = vfmadd231ps_fma(auVar225,auVar19,auVar203);
    auVar135 = ZEXT816(0) << 0x20;
    auVar204._0_4_ = fVar68 * 0.0;
    auVar204._4_4_ = fVar103 * 0.0;
    auVar204._8_4_ = fVar147 * 0.0;
    auVar204._12_4_ = fVar69 * 0.0;
    auVar22 = vfmadd231ps_fma(auVar204,auVar188,auVar298);
    auVar22 = vfmadd231ps_fma(auVar22,auVar20,auVar135);
    auVar115 = vfnmadd231ps_fma(auVar22,auVar19,auVar298);
    auVar291._0_4_ = *(float *)*pauVar3 * 0.5;
    auVar291._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
    auVar291._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
    auVar291._12_4_ = *(float *)(*pauVar3 + 0xc) * 0.5;
    auVar22 = vfmadd231ps_fma(auVar291,auVar135,auVar160);
    auVar22 = vfnmadd231ps_fma(auVar22,auVar298,auVar17);
    auVar72 = vfmadd231ps_fma(auVar22,auVar135,auVar16);
    auVar249._0_4_ = auVar248._0_4_ + auVar188._0_4_;
    auVar249._4_4_ = auVar248._4_4_ + auVar188._4_4_;
    auVar249._8_4_ = auVar248._8_4_ + auVar188._8_4_;
    auVar249._12_4_ = auVar248._12_4_ + auVar188._12_4_;
    auVar22 = vfmadd231ps_fma(auVar249,auVar20,auVar135);
    auVar148._8_4_ = 0x80000000;
    auVar148._0_8_ = 0x8000000080000000;
    auVar148._12_4_ = 0x80000000;
    auVar22 = vfmadd231ps_fma(auVar22,auVar19,auVar148);
    auVar183._0_4_ = fVar68 * 0.5;
    auVar183._4_4_ = fVar103 * 0.5;
    auVar183._8_4_ = fVar147 * 0.5;
    auVar183._12_4_ = fVar69 * 0.5;
    auVar188 = vfmadd231ps_fma(auVar183,auVar135,auVar188);
    auVar20 = vfnmadd231ps_fma(auVar188,auVar298,auVar20);
    auVar188 = vfmadd231ps_fma(auVar20,auVar135,auVar19);
    auVar19 = vshufps_avx(auVar293,auVar293,0xc9);
    auVar20 = vshufps_avx(auVar21,auVar21,0xc9);
    fVar244 = auVar293._0_4_;
    auVar110._0_4_ = fVar244 * auVar20._0_4_;
    fVar264 = auVar293._4_4_;
    auVar110._4_4_ = fVar264 * auVar20._4_4_;
    fVar277 = auVar293._8_4_;
    auVar110._8_4_ = fVar277 * auVar20._8_4_;
    fVar105 = auVar293._12_4_;
    auVar110._12_4_ = fVar105 * auVar20._12_4_;
    auVar73 = vfmsub231ps_fma(auVar110,auVar19,auVar21);
    auVar20 = vshufps_avx(auVar115,auVar115,0xc9);
    auVar111._0_4_ = fVar244 * auVar20._0_4_;
    auVar111._4_4_ = fVar264 * auVar20._4_4_;
    auVar111._8_4_ = fVar277 * auVar20._8_4_;
    auVar111._12_4_ = fVar105 * auVar20._12_4_;
    auVar71 = vfmsub231ps_fma(auVar111,auVar19,auVar115);
    auVar19 = vshufps_avx(auVar72,auVar72,0xc9);
    auVar20 = vshufps_avx(auVar22,auVar22,0xc9);
    fVar240 = auVar72._0_4_;
    auVar112._0_4_ = fVar240 * auVar20._0_4_;
    fVar241 = auVar72._4_4_;
    auVar112._4_4_ = fVar241 * auVar20._4_4_;
    fVar242 = auVar72._8_4_;
    auVar112._8_4_ = fVar242 * auVar20._8_4_;
    fVar243 = auVar72._12_4_;
    auVar112._12_4_ = fVar243 * auVar20._12_4_;
    auVar301 = vfmsub231ps_fma(auVar112,auVar19,auVar22);
    auVar20 = vshufps_avx(auVar188,auVar188,0xc9);
    auVar113._0_4_ = fVar240 * auVar20._0_4_;
    auVar113._4_4_ = fVar241 * auVar20._4_4_;
    auVar113._8_4_ = fVar242 * auVar20._8_4_;
    auVar113._12_4_ = fVar243 * auVar20._12_4_;
    auVar107 = vfmsub231ps_fma(auVar113,auVar19,auVar188);
    lVar12 = *(long *)(_Var10 + 0x38 + lVar66);
    lVar13 = *(long *)(_Var10 + 0x48 + lVar66);
    auVar19 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar62);
    auVar20 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
    pauVar5 = (undefined1 (*) [12])(lVar12 + lVar13 * lVar2);
    auVar56 = *pauVar5;
    fVar146 = *(float *)pauVar5[1];
    lVar14 = *(long *)(lVar11 + 0x38 + lVar66);
    lVar11 = *(long *)(lVar11 + 0x48 + lVar66);
    auVar279._0_4_ = *(float *)*pauVar5 * 0.0;
    auVar279._4_4_ = *(float *)(*pauVar5 + 4) * 0.0;
    auVar279._8_4_ = *(float *)(*pauVar5 + 8) * 0.0;
    auVar279._12_4_ = fVar146 * 0.0;
    auVar188 = vfmadd231ps_fma(auVar279,auVar20,auVar298);
    auVar21 = vfmadd231ps_fma(auVar188,auVar19,auVar135);
    auVar188 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar60);
    auVar134 = vfnmadd231ps_fma(auVar21,auVar188,auVar298);
    auVar21 = *(undefined1 (*) [16])(lVar14 + lVar1 * lVar11);
    pfVar4 = (float *)(lVar14 + lVar11 * lVar2);
    fVar68 = *pfVar4;
    fVar103 = pfVar4[1];
    fVar147 = pfVar4[2];
    fVar69 = pfVar4[3];
    auVar226._8_4_ = 0x80000000;
    auVar226._0_8_ = 0x8000000080000000;
    auVar226._12_4_ = 0x80000000;
    auVar149._0_4_ = fVar68 * -0.0;
    auVar149._4_4_ = fVar103 * -0.0;
    auVar149._8_4_ = fVar147 * -0.0;
    auVar149._12_4_ = fVar69 * -0.0;
    auVar115 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar21,auVar149);
    auVar22 = *(undefined1 (*) [16])(lVar14 + lVar62 * lVar11);
    auVar184._0_4_ = auVar22._0_4_ + auVar115._0_4_;
    auVar184._4_4_ = auVar22._4_4_ + auVar115._4_4_;
    auVar184._8_4_ = auVar22._8_4_ + auVar115._8_4_;
    auVar184._12_4_ = auVar22._12_4_ + auVar115._12_4_;
    auVar115 = *(undefined1 (*) [16])(lVar14 + uVar60 * lVar11);
    auVar150 = vfmadd231ps_fma(auVar184,auVar115,auVar226);
    auVar135 = vshufps_avx(auVar150,auVar150,0xc9);
    fVar221 = auVar134._0_4_;
    auVar74._0_4_ = fVar221 * auVar135._0_4_;
    fVar222 = auVar134._4_4_;
    auVar74._4_4_ = fVar222 * auVar135._4_4_;
    fVar238 = auVar134._8_4_;
    auVar74._8_4_ = fVar238 * auVar135._8_4_;
    fVar239 = auVar134._12_4_;
    auVar74._12_4_ = fVar239 * auVar135._12_4_;
    auVar135 = vshufps_avx(auVar134,auVar134,0xc9);
    auVar108 = vfmsub231ps_fma(auVar74,auVar135,auVar150);
    auVar75._0_4_ = fVar68 * 0.0;
    auVar75._4_4_ = fVar103 * 0.0;
    auVar75._8_4_ = fVar147 * 0.0;
    auVar75._12_4_ = fVar69 * 0.0;
    auVar171._8_4_ = 0x3f000000;
    auVar171._0_8_ = 0x3f0000003f000000;
    auVar171._12_4_ = 0x3f000000;
    auVar150 = vfmadd231ps_fma(auVar75,auVar21,auVar171);
    auVar150 = vfmadd231ps_fma(auVar150,auVar22,ZEXT816(0) << 0x20);
    auVar109 = vfnmadd231ps_fma(auVar150,auVar115,auVar171);
    auVar150 = vshufps_avx(auVar109,auVar109,0xc9);
    auVar185._0_4_ = fVar221 * auVar150._0_4_;
    auVar185._4_4_ = fVar222 * auVar150._4_4_;
    auVar185._8_4_ = fVar238 * auVar150._8_4_;
    auVar185._12_4_ = fVar239 * auVar150._12_4_;
    auVar109 = vfmsub231ps_fma(auVar185,auVar135,auVar109);
    auVar76._0_4_ = auVar21._0_4_ + auVar149._0_4_;
    auVar76._4_4_ = auVar21._4_4_ + auVar149._4_4_;
    auVar76._8_4_ = auVar21._8_4_ + auVar149._8_4_;
    auVar76._12_4_ = auVar21._12_4_ + auVar149._12_4_;
    auVar114._0_4_ = fVar68 * 0.5;
    auVar114._4_4_ = fVar103 * 0.5;
    auVar114._8_4_ = fVar147 * 0.5;
    auVar114._12_4_ = fVar69 * 0.5;
    auVar150 = ZEXT416(0) << 0x20;
    auVar21 = vfmadd231ps_fma(auVar114,auVar150,auVar21);
    auVar135 = vfmadd231ps_fma(auVar76,auVar22,auVar150);
    auVar21 = vfnmadd231ps_fma(auVar21,auVar171,auVar22);
    auVar22 = vfmadd231ps_fma(auVar135,auVar115,auVar226);
    auVar115 = vfmadd231ps_fma(auVar21,auVar150,auVar115);
    auVar331._0_4_ = *(float *)*pauVar5 * 0.5;
    auVar331._4_4_ = *(float *)(*pauVar5 + 4) * 0.5;
    auVar331._8_4_ = *(float *)(*pauVar5 + 8) * 0.5;
    auVar331._12_4_ = fVar146 * 0.5;
    auVar21 = vfmadd231ps_fma(auVar331,auVar150,auVar20);
    auVar21 = vfnmadd231ps_fma(auVar21,auVar171,auVar19);
    auVar135 = vfmadd231ps_fma(auVar21,auVar150,auVar188);
    auVar52._12_4_ = 0;
    auVar52._0_12_ = ZEXT812(0);
    auVar21 = vshufps_avx(auVar22,auVar22,0xc9);
    fVar330 = auVar135._0_4_;
    auVar151._0_4_ = fVar330 * auVar21._0_4_;
    fVar338 = auVar135._4_4_;
    auVar151._4_4_ = fVar338 * auVar21._4_4_;
    fVar339 = auVar135._8_4_;
    auVar151._8_4_ = fVar339 * auVar21._8_4_;
    fVar340 = auVar135._12_4_;
    auVar151._12_4_ = fVar340 * auVar21._12_4_;
    auVar21 = vshufps_avx(auVar135,auVar135,0xc9);
    auVar132 = vfmsub231ps_fma(auVar151,auVar21,auVar22);
    auVar22 = vshufps_avx(auVar115,auVar115,0xc9);
    auVar77._0_4_ = fVar330 * auVar22._0_4_;
    auVar77._4_4_ = fVar338 * auVar22._4_4_;
    auVar77._8_4_ = fVar339 * auVar22._8_4_;
    auVar77._12_4_ = fVar340 * auVar22._12_4_;
    auVar133 = vfmsub231ps_fma(auVar77,auVar21,auVar115);
    fVar104 = fVar104 - auVar23._0_4_;
    local_760._0_4_ = auVar170._0_4_;
    local_760._4_4_ = auVar170._4_4_;
    uStack_758._0_4_ = auVar170._8_4_;
    uStack_758._4_4_ = auVar170._12_4_;
    auVar78._0_4_ = (float)local_760._0_4_ * -0.0;
    auVar78._4_4_ = (float)local_760._4_4_ * -0.0;
    auVar78._8_4_ = (float)uStack_758 * -0.0;
    auVar78._12_4_ = uStack_758._4_4_ * -0.0;
    auVar21 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar160,auVar78);
    auVar172._0_4_ = auVar160._0_4_ + auVar78._0_4_;
    auVar172._4_4_ = auVar160._4_4_ + auVar78._4_4_;
    auVar172._8_4_ = auVar160._8_4_ + auVar78._8_4_;
    auVar172._12_4_ = auVar160._12_4_ + auVar78._12_4_;
    auVar186._0_4_ = auVar17._0_4_ + auVar21._0_4_;
    auVar186._4_4_ = auVar17._4_4_ + auVar21._4_4_;
    auVar186._8_4_ = auVar17._8_4_ + auVar21._8_4_;
    auVar186._12_4_ = auVar17._12_4_ + auVar21._12_4_;
    auVar22 = vpermilps_avx(auVar73,0xc9);
    auVar160 = vdpps_avx(auVar22,auVar22,0x7f);
    auVar17 = vfmadd231ps_fma(auVar172,auVar17,auVar52 << 0x20);
    auVar23 = vfmadd231ps_fma(auVar186,auVar16,auVar226);
    auVar150 = vfmadd231ps_fma(auVar17,auVar16,auVar226);
    fVar103 = auVar160._0_4_;
    auVar115 = ZEXT416((uint)fVar103);
    auVar16 = vrsqrtss_avx(auVar115,auVar115);
    fVar68 = auVar16._0_4_;
    fVar68 = fVar68 * 1.5 + fVar68 * fVar68 * fVar103 * -0.5 * fVar68;
    auVar17 = vpermilps_avx(auVar71,0xc9);
    auVar16 = vdpps_avx(auVar22,auVar17,0x7f);
    auVar227._0_4_ = fVar103 * auVar17._0_4_;
    auVar227._4_4_ = fVar103 * auVar17._4_4_;
    auVar227._8_4_ = fVar103 * auVar17._8_4_;
    auVar227._12_4_ = fVar103 * auVar17._12_4_;
    fVar103 = auVar16._0_4_;
    auVar266._0_4_ = fVar103 * auVar22._0_4_;
    auVar266._4_4_ = fVar103 * auVar22._4_4_;
    auVar266._8_4_ = fVar103 * auVar22._8_4_;
    auVar266._12_4_ = fVar103 * auVar22._12_4_;
    auVar21 = vsubps_avx(auVar227,auVar266);
    auVar16 = vrcpss_avx(auVar115,auVar115);
    auVar17 = vfnmadd213ss_fma(auVar160,auVar16,SUB6416(ZEXT464(0x40000000),0));
    fVar147 = auVar16._0_4_ * auVar17._0_4_;
    auVar115 = vpermilps_avx(auVar301,0xc9);
    auVar17 = vdpps_avx(auVar115,auVar115,0x7f);
    fVar245 = auVar22._0_4_ * fVar68;
    fVar261 = auVar22._4_4_ * fVar68;
    fVar262 = auVar22._8_4_ * fVar68;
    fVar263 = auVar22._12_4_ * fVar68;
    auVar22 = vpermilps_avx(auVar107,0xc9);
    auVar16 = vblendps_avx(auVar17,_DAT_01f7aa10,0xe);
    auVar160 = vrsqrtss_avx(auVar16,auVar16);
    fVar69 = auVar17._0_4_;
    fVar103 = auVar160._0_4_;
    auVar160 = vdpps_avx(auVar115,auVar22,0x7f);
    fVar103 = fVar103 * 1.5 + fVar103 * fVar69 * -0.5 * fVar103 * fVar103;
    auVar116._0_4_ = fVar69 * auVar22._0_4_;
    auVar116._4_4_ = fVar69 * auVar22._4_4_;
    auVar116._8_4_ = fVar69 * auVar22._8_4_;
    auVar116._12_4_ = fVar69 * auVar22._12_4_;
    fVar69 = auVar160._0_4_;
    auVar136._0_4_ = fVar69 * auVar115._0_4_;
    auVar136._4_4_ = fVar69 * auVar115._4_4_;
    auVar136._8_4_ = fVar69 * auVar115._8_4_;
    auVar136._12_4_ = fVar69 * auVar115._12_4_;
    auVar160 = vsubps_avx(auVar116,auVar136);
    auVar16 = vrcpss_avx(auVar16,auVar16);
    auVar17 = vfnmadd213ss_fma(auVar17,auVar16,ZEXT416(0x40000000));
    fVar69 = auVar16._0_4_ * auVar17._0_4_;
    fVar145 = auVar115._0_4_ * fVar103;
    fVar167 = auVar115._4_4_ * fVar103;
    fVar168 = auVar115._8_4_ * fVar103;
    fVar169 = auVar115._12_4_ * fVar103;
    auVar16 = vshufps_avx(auVar293,auVar293,0xff);
    auVar17 = vshufps_avx(auVar23,auVar23,0xff);
    auVar205._0_4_ = fVar245 * auVar17._0_4_;
    auVar205._4_4_ = fVar261 * auVar17._4_4_;
    auVar205._8_4_ = fVar262 * auVar17._8_4_;
    auVar205._12_4_ = fVar263 * auVar17._12_4_;
    auVar117._0_4_ = fVar245 * auVar16._0_4_ + fVar68 * fVar147 * auVar21._0_4_ * auVar17._0_4_;
    auVar117._4_4_ = fVar261 * auVar16._4_4_ + fVar68 * fVar147 * auVar21._4_4_ * auVar17._4_4_;
    auVar117._8_4_ = fVar262 * auVar16._8_4_ + fVar68 * fVar147 * auVar21._8_4_ * auVar17._8_4_;
    auVar117._12_4_ = fVar263 * auVar16._12_4_ + fVar68 * fVar147 * auVar21._12_4_ * auVar17._12_4_;
    auVar21 = vsubps_avx(auVar23,auVar205);
    local_650._0_4_ = auVar23._0_4_ + auVar205._0_4_;
    local_650._4_4_ = auVar23._4_4_ + auVar205._4_4_;
    fStack_648 = auVar23._8_4_ + auVar205._8_4_;
    fStack_644 = auVar23._12_4_ + auVar205._12_4_;
    auVar22 = vsubps_avx(auVar293,auVar117);
    auVar16 = vshufps_avx(auVar72,auVar72,0xff);
    auVar17 = vshufps_avx(auVar150,auVar150,0xff);
    auVar152._0_4_ = auVar17._0_4_ * fVar145;
    auVar152._4_4_ = auVar17._4_4_ * fVar167;
    auVar152._8_4_ = auVar17._8_4_ * fVar168;
    auVar152._12_4_ = auVar17._12_4_ * fVar169;
    auVar187._0_4_ = auVar16._0_4_ * fVar145 + auVar17._0_4_ * fVar103 * auVar160._0_4_ * fVar69;
    auVar187._4_4_ = auVar16._4_4_ * fVar167 + auVar17._4_4_ * fVar103 * auVar160._4_4_ * fVar69;
    auVar187._8_4_ = auVar16._8_4_ * fVar168 + auVar17._8_4_ * fVar103 * auVar160._8_4_ * fVar69;
    auVar187._12_4_ = auVar16._12_4_ * fVar169 + auVar17._12_4_ * fVar103 * auVar160._12_4_ * fVar69
    ;
    auVar160 = vsubps_avx(auVar150,auVar152);
    local_760._4_4_ = auVar150._4_4_ + auVar152._4_4_;
    local_760._0_4_ = auVar150._0_4_ + auVar152._0_4_;
    uStack_758._0_4_ = auVar150._8_4_ + auVar152._8_4_;
    uStack_758._4_4_ = auVar150._12_4_ + auVar152._12_4_;
    auVar115 = vsubps_avx(auVar72,auVar187);
    auVar79._8_4_ = 0x80000000;
    auVar79._0_8_ = 0x8000000080000000;
    auVar79._12_4_ = 0x80000000;
    local_680 = auVar56._0_4_;
    fStack_67c = auVar56._4_4_;
    fStack_678 = auVar56._8_4_;
    auVar153._0_4_ = local_680 * -0.0;
    auVar153._4_4_ = fStack_67c * -0.0;
    auVar153._8_4_ = fStack_678 * -0.0;
    auVar153._12_4_ = fVar146 * -0.0;
    auVar16 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar20,auVar153);
    auVar228._0_4_ = auVar20._0_4_ + auVar153._0_4_;
    auVar228._4_4_ = auVar20._4_4_ + auVar153._4_4_;
    auVar228._8_4_ = auVar20._8_4_ + auVar153._8_4_;
    auVar228._12_4_ = auVar20._12_4_ + auVar153._12_4_;
    auVar322._0_4_ = auVar19._0_4_ + auVar16._0_4_;
    auVar322._4_4_ = auVar19._4_4_ + auVar16._4_4_;
    auVar322._8_4_ = auVar19._8_4_ + auVar16._8_4_;
    auVar322._12_4_ = auVar19._12_4_ + auVar16._12_4_;
    auVar17 = vfmadd231ps_fma(auVar228,auVar19,ZEXT816(0) << 0x20);
    auVar23 = vfmadd231ps_fma(auVar322,auVar188,auVar79);
    auVar20 = vpermilps_avx(auVar108,0xc9);
    auVar16 = vdpps_avx(auVar20,auVar20,0x7f);
    auVar150 = vfmadd231ps_fma(auVar17,auVar188,auVar79);
    fVar103 = auVar16._0_4_;
    auVar188 = ZEXT416((uint)fVar103);
    auVar17 = vrsqrtss_avx(auVar188,auVar188);
    fVar68 = auVar17._0_4_;
    fVar68 = fVar103 * -0.5 * fVar68 * fVar68 * fVar68 + fVar68 * 1.5;
    auVar17 = vpermilps_avx(auVar109,0xc9);
    auVar267._0_4_ = fVar103 * auVar17._0_4_;
    auVar267._4_4_ = fVar103 * auVar17._4_4_;
    auVar267._8_4_ = fVar103 * auVar17._8_4_;
    auVar267._12_4_ = fVar103 * auVar17._12_4_;
    auVar17 = vdpps_avx(auVar20,auVar17,0x7f);
    fVar103 = auVar17._0_4_;
    auVar250._0_4_ = fVar103 * auVar20._0_4_;
    auVar250._4_4_ = fVar103 * auVar20._4_4_;
    auVar250._8_4_ = fVar103 * auVar20._8_4_;
    auVar250._12_4_ = fVar103 * auVar20._12_4_;
    auVar19 = vsubps_avx(auVar267,auVar250);
    auVar17 = vrcpss_avx(auVar188,auVar188);
    auVar16 = vfnmadd213ss_fma(auVar16,auVar17,SUB6416(ZEXT464(0x40000000),0));
    fVar147 = auVar17._0_4_ * auVar16._0_4_;
    fVar146 = auVar20._0_4_ * fVar68;
    fVar145 = auVar20._4_4_ * fVar68;
    fVar167 = auVar20._8_4_ * fVar68;
    fVar168 = auVar20._12_4_ * fVar68;
    auVar188 = vpermilps_avx(auVar132,0xc9);
    auVar16 = vdpps_avx(auVar188,auVar188,0x7f);
    fVar69 = auVar16._0_4_;
    auVar72 = ZEXT416((uint)fVar69);
    auVar17 = vrsqrtss_avx(auVar72,auVar72);
    fVar103 = auVar17._0_4_;
    auVar20 = vpermilps_avx(auVar133,0xc9);
    auVar17 = vdpps_avx(auVar188,auVar20,0x7f);
    fVar103 = fVar103 * 1.5 + fVar69 * -0.5 * fVar103 * fVar103 * fVar103;
    auVar299._0_4_ = fVar69 * auVar20._0_4_;
    auVar299._4_4_ = fVar69 * auVar20._4_4_;
    auVar299._8_4_ = fVar69 * auVar20._8_4_;
    auVar299._12_4_ = fVar69 * auVar20._12_4_;
    fVar69 = auVar17._0_4_;
    auVar80._0_4_ = fVar69 * auVar188._0_4_;
    auVar80._4_4_ = fVar69 * auVar188._4_4_;
    auVar80._8_4_ = fVar69 * auVar188._8_4_;
    auVar80._12_4_ = fVar69 * auVar188._12_4_;
    auVar20 = vsubps_avx(auVar299,auVar80);
    auVar17 = vrcpss_avx(auVar72,auVar72);
    auVar16 = vfnmadd213ss_fma(auVar16,auVar17,SUB6416(ZEXT464(0x40000000),0));
    fVar69 = auVar17._0_4_ * auVar16._0_4_;
    fVar169 = auVar188._0_4_ * fVar103;
    fVar245 = auVar188._4_4_ * fVar103;
    fVar261 = auVar188._8_4_ * fVar103;
    fVar262 = auVar188._12_4_ * fVar103;
    auVar16 = vshufps_avx(auVar134,auVar134,0xff);
    auVar17 = vshufps_avx(auVar23,auVar23,0xff);
    auVar154._0_4_ = auVar17._0_4_ * fVar146;
    auVar154._4_4_ = auVar17._4_4_ * fVar145;
    auVar154._8_4_ = auVar17._8_4_ * fVar167;
    auVar154._12_4_ = auVar17._12_4_ * fVar168;
    auVar173._0_4_ = auVar16._0_4_ * fVar146 + auVar17._0_4_ * fVar68 * auVar19._0_4_ * fVar147;
    auVar173._4_4_ = auVar16._4_4_ * fVar145 + auVar17._4_4_ * fVar68 * auVar19._4_4_ * fVar147;
    auVar173._8_4_ = auVar16._8_4_ * fVar167 + auVar17._8_4_ * fVar68 * auVar19._8_4_ * fVar147;
    auVar173._12_4_ = auVar16._12_4_ * fVar168 + auVar17._12_4_ * fVar68 * auVar19._12_4_ * fVar147;
    auVar19 = vsubps_avx(auVar23,auVar154);
    fVar147 = auVar23._0_4_ + auVar154._0_4_;
    fVar146 = auVar23._4_4_ + auVar154._4_4_;
    fVar145 = auVar23._8_4_ + auVar154._8_4_;
    fVar167 = auVar23._12_4_ + auVar154._12_4_;
    auVar188 = vsubps_avx(auVar134,auVar173);
    auVar16 = vshufps_avx(auVar135,auVar135,0xff);
    auVar17 = vshufps_avx(auVar150,auVar150,0xff);
    auVar251._0_4_ = fVar169 * auVar17._0_4_;
    auVar251._4_4_ = fVar245 * auVar17._4_4_;
    auVar251._8_4_ = fVar261 * auVar17._8_4_;
    auVar251._12_4_ = fVar262 * auVar17._12_4_;
    auVar81._0_4_ = fVar169 * auVar16._0_4_ + auVar17._0_4_ * fVar103 * auVar20._0_4_ * fVar69;
    auVar81._4_4_ = fVar245 * auVar16._4_4_ + auVar17._4_4_ * fVar103 * auVar20._4_4_ * fVar69;
    auVar81._8_4_ = fVar261 * auVar16._8_4_ + auVar17._8_4_ * fVar103 * auVar20._8_4_ * fVar69;
    auVar81._12_4_ = fVar262 * auVar16._12_4_ + auVar17._12_4_ * fVar103 * auVar20._12_4_ * fVar69;
    auVar16 = vsubps_avx(auVar150,auVar251);
    auVar174._0_4_ = auVar251._0_4_ + auVar150._0_4_;
    auVar174._4_4_ = auVar251._4_4_ + auVar150._4_4_;
    auVar174._8_4_ = auVar251._8_4_ + auVar150._8_4_;
    auVar174._12_4_ = auVar251._12_4_ + auVar150._12_4_;
    auVar17 = vsubps_avx(auVar135,auVar81);
    local_6a0._0_4_ = auVar22._0_4_;
    local_6a0._4_4_ = auVar22._4_4_;
    uStack_698._0_4_ = auVar22._8_4_;
    uStack_698._4_4_ = auVar22._12_4_;
    auVar82._0_4_ = auVar21._0_4_ + (float)local_6a0._0_4_ * 0.33333334;
    auVar82._4_4_ = auVar21._4_4_ + (float)local_6a0._4_4_ * 0.33333334;
    auVar82._8_4_ = auVar21._8_4_ + (float)uStack_698 * 0.33333334;
    auVar82._12_4_ = auVar21._12_4_ + uStack_698._4_4_ * 0.33333334;
    fVar68 = 1.0 - fVar104;
    auVar229._4_4_ = fVar68;
    auVar229._0_4_ = fVar68;
    auVar229._8_4_ = fVar68;
    auVar229._12_4_ = fVar68;
    auVar300._0_4_ = fVar104 * auVar19._0_4_;
    auVar300._4_4_ = fVar104 * auVar19._4_4_;
    auVar300._8_4_ = fVar104 * auVar19._8_4_;
    auVar300._12_4_ = fVar104 * auVar19._12_4_;
    local_4f0 = vfmadd231ps_fma(auVar300,auVar229,auVar21);
    auVar137._0_4_ = fVar104 * (auVar19._0_4_ + auVar188._0_4_ * 0.33333334);
    auVar137._4_4_ = fVar104 * (auVar19._4_4_ + auVar188._4_4_ * 0.33333334);
    auVar137._8_4_ = fVar104 * (auVar19._8_4_ + auVar188._8_4_ * 0.33333334);
    auVar137._12_4_ = fVar104 * (auVar19._12_4_ + auVar188._12_4_ * 0.33333334);
    auVar22 = vfmadd231ps_fma(auVar137,auVar229,auVar82);
    local_770 = auVar115._0_4_;
    fStack_76c = auVar115._4_4_;
    fStack_768 = auVar115._8_4_;
    fStack_764 = auVar115._12_4_;
    auVar83._0_4_ = local_770 * 0.33333334;
    auVar83._4_4_ = fStack_76c * 0.33333334;
    auVar83._8_4_ = fStack_768 * 0.33333334;
    auVar83._12_4_ = fStack_764 * 0.33333334;
    auVar19 = vsubps_avx(auVar160,auVar83);
    auVar311._0_4_ = (float)local_650._0_4_ + (fVar244 + auVar117._0_4_) * 0.33333334;
    auVar311._4_4_ = (float)local_650._4_4_ + (fVar264 + auVar117._4_4_) * 0.33333334;
    auVar311._8_4_ = fStack_648 + (fVar277 + auVar117._8_4_) * 0.33333334;
    auVar311._12_4_ = fStack_644 + (fVar105 + auVar117._12_4_) * 0.33333334;
    auVar292._0_4_ = (fVar240 + auVar187._0_4_) * 0.33333334;
    auVar292._4_4_ = (fVar241 + auVar187._4_4_) * 0.33333334;
    auVar292._8_4_ = (fVar242 + auVar187._8_4_) * 0.33333334;
    auVar292._12_4_ = (fVar243 + auVar187._12_4_) * 0.33333334;
    auVar20 = vsubps_avx(_local_760,auVar292);
    auVar280._0_4_ = auVar17._0_4_ * 0.33333334;
    auVar280._4_4_ = auVar17._4_4_ * 0.33333334;
    auVar280._8_4_ = auVar17._8_4_ * 0.33333334;
    auVar280._12_4_ = auVar17._12_4_ * 0.33333334;
    auVar17 = vsubps_avx(auVar16,auVar280);
    auVar252._0_4_ = (fVar330 + auVar81._0_4_) * 0.33333334;
    auVar252._4_4_ = (fVar338 + auVar81._4_4_) * 0.33333334;
    auVar252._8_4_ = (fVar339 + auVar81._8_4_) * 0.33333334;
    auVar252._12_4_ = (fVar340 + auVar81._12_4_) * 0.33333334;
    auVar188 = vsubps_avx(auVar174,auVar252);
    auVar281._0_4_ = fVar104 * auVar17._0_4_;
    auVar281._4_4_ = fVar104 * auVar17._4_4_;
    auVar281._8_4_ = fVar104 * auVar17._8_4_;
    auVar281._12_4_ = fVar104 * auVar17._12_4_;
    auVar206._0_4_ = fVar104 * auVar16._0_4_;
    auVar206._4_4_ = fVar104 * auVar16._4_4_;
    auVar206._8_4_ = fVar104 * auVar16._8_4_;
    auVar206._12_4_ = fVar104 * auVar16._12_4_;
    local_500 = vfmadd231ps_fma(auVar281,auVar229,auVar19);
    auVar115 = vfmadd231ps_fma(auVar206,auVar229,auVar160);
    auVar84._0_4_ = fVar104 * fVar147;
    auVar84._4_4_ = fVar104 * fVar146;
    auVar84._8_4_ = fVar104 * fVar145;
    auVar84._12_4_ = fVar104 * fVar167;
    auVar118._0_4_ = fVar104 * (fVar147 + (fVar221 + auVar173._0_4_) * 0.33333334);
    auVar118._4_4_ = fVar104 * (fVar146 + (fVar222 + auVar173._4_4_) * 0.33333334);
    auVar118._8_4_ = fVar104 * (fVar145 + (fVar238 + auVar173._8_4_) * 0.33333334);
    auVar118._12_4_ = fVar104 * (fVar167 + (fVar239 + auVar173._12_4_) * 0.33333334);
    auVar155._0_4_ = fVar104 * auVar188._0_4_;
    auVar155._4_4_ = fVar104 * auVar188._4_4_;
    auVar155._8_4_ = fVar104 * auVar188._8_4_;
    auVar155._12_4_ = fVar104 * auVar188._12_4_;
    auVar175._0_4_ = fVar104 * auVar174._0_4_;
    auVar175._4_4_ = fVar104 * auVar174._4_4_;
    auVar175._8_4_ = fVar104 * auVar174._8_4_;
    auVar175._12_4_ = fVar104 * auVar174._12_4_;
    _local_510 = vfmadd231ps_fma(auVar84,auVar229,_local_650);
    auVar23 = vfmadd231ps_fma(auVar118,auVar229,auVar311);
    auVar135 = vfmadd231ps_fma(auVar155,auVar229,auVar20);
    auVar150 = vfmadd231ps_fma(auVar175,auVar229,_local_760);
    auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    local_4d0 = vsubps_avx(local_4f0,auVar16);
    auVar17 = vshufps_avx(local_4d0,local_4d0,0x55);
    auVar160 = vshufps_avx(local_4d0,local_4d0,0xaa);
    aVar6 = pre->ray_space[k].vy.field_0;
    fVar68 = pre->ray_space[k].vz.field_0.m128[0];
    fVar103 = pre->ray_space[k].vz.field_0.m128[1];
    fVar104 = pre->ray_space[k].vz.field_0.m128[2];
    fVar147 = pre->ray_space[k].vz.field_0.m128[3];
    auVar85._0_4_ = fVar68 * auVar160._0_4_;
    auVar85._4_4_ = fVar103 * auVar160._4_4_;
    auVar85._8_4_ = fVar104 * auVar160._8_4_;
    auVar85._12_4_ = fVar147 * auVar160._12_4_;
    auVar19 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar6,auVar17);
    local_4e0 = vsubps_avx(auVar22,auVar16);
    auVar17 = vshufps_avx(local_4e0,local_4e0,0x55);
    auVar160 = vshufps_avx(local_4e0,local_4e0,0xaa);
    auVar332._0_4_ = fVar68 * auVar160._0_4_;
    auVar332._4_4_ = fVar103 * auVar160._4_4_;
    auVar332._8_4_ = fVar104 * auVar160._8_4_;
    auVar332._12_4_ = fVar147 * auVar160._12_4_;
    auVar160 = vfmadd231ps_fma(auVar332,(undefined1  [16])aVar6,auVar17);
    local_3c0 = vsubps_avx(local_500,auVar16);
    auVar17 = vshufps_avx(local_3c0,local_3c0,0xaa);
    auVar312._0_4_ = fVar68 * auVar17._0_4_;
    auVar312._4_4_ = fVar103 * auVar17._4_4_;
    auVar312._8_4_ = fVar104 * auVar17._8_4_;
    auVar312._12_4_ = fVar147 * auVar17._12_4_;
    auVar17 = vshufps_avx(local_3c0,local_3c0,0x55);
    auVar20 = vfmadd231ps_fma(auVar312,(undefined1  [16])aVar6,auVar17);
    local_3d0 = vsubps_avx(auVar115,auVar16);
    auVar17 = vshufps_avx(local_3d0,local_3d0,0xaa);
    auVar323._0_4_ = fVar68 * auVar17._0_4_;
    auVar323._4_4_ = fVar103 * auVar17._4_4_;
    auVar323._8_4_ = fVar104 * auVar17._8_4_;
    auVar323._12_4_ = fVar147 * auVar17._12_4_;
    auVar17 = vshufps_avx(local_3d0,local_3d0,0x55);
    auVar188 = vfmadd231ps_fma(auVar323,(undefined1  [16])aVar6,auVar17);
    local_3e0 = vsubps_avx(_local_510,auVar16);
    auVar17 = vshufps_avx(local_3e0,local_3e0,0xaa);
    auVar176._0_4_ = fVar68 * auVar17._0_4_;
    auVar176._4_4_ = fVar103 * auVar17._4_4_;
    auVar176._8_4_ = fVar104 * auVar17._8_4_;
    auVar176._12_4_ = fVar147 * auVar17._12_4_;
    auVar17 = vshufps_avx(local_3e0,local_3e0,0x55);
    auVar21 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar6,auVar17);
    local_3f0 = vsubps_avx(auVar23,auVar16);
    auVar17 = vshufps_avx(local_3f0,local_3f0,0xaa);
    auVar230._0_4_ = fVar68 * auVar17._0_4_;
    auVar230._4_4_ = fVar103 * auVar17._4_4_;
    auVar230._8_4_ = fVar104 * auVar17._8_4_;
    auVar230._12_4_ = fVar147 * auVar17._12_4_;
    auVar17 = vshufps_avx(local_3f0,local_3f0,0x55);
    auVar72 = vfmadd231ps_fma(auVar230,(undefined1  [16])aVar6,auVar17);
    local_400 = vsubps_avx(auVar135,auVar16);
    auVar17 = vshufps_avx(local_400,local_400,0xaa);
    auVar268._0_4_ = fVar68 * auVar17._0_4_;
    auVar268._4_4_ = fVar103 * auVar17._4_4_;
    auVar268._8_4_ = fVar104 * auVar17._8_4_;
    auVar268._12_4_ = fVar147 * auVar17._12_4_;
    auVar17 = vshufps_avx(local_400,local_400,0x55);
    auVar17 = vfmadd231ps_fma(auVar268,(undefined1  [16])aVar6,auVar17);
    local_410 = vsubps_avx(auVar150,auVar16);
    auVar16 = vshufps_avx(local_410,local_410,0xaa);
    auVar189._0_4_ = fVar68 * auVar16._0_4_;
    auVar189._4_4_ = fVar103 * auVar16._4_4_;
    auVar189._8_4_ = fVar104 * auVar16._8_4_;
    auVar189._12_4_ = fVar147 * auVar16._12_4_;
    auVar16 = vshufps_avx(local_410,local_410,0x55);
    auVar16 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar6,auVar16);
    auVar207._4_4_ = local_4d0._0_4_;
    auVar207._0_4_ = local_4d0._0_4_;
    auVar207._8_4_ = local_4d0._0_4_;
    auVar207._12_4_ = local_4d0._0_4_;
    aVar6 = pre->ray_space[k].vx.field_0;
    auVar73 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar6,auVar207);
    auVar208._4_4_ = local_4e0._0_4_;
    auVar208._0_4_ = local_4e0._0_4_;
    auVar208._8_4_ = local_4e0._0_4_;
    auVar208._12_4_ = local_4e0._0_4_;
    auVar71 = vfmadd231ps_fma(auVar160,(undefined1  [16])aVar6,auVar208);
    uVar70 = local_3c0._0_4_;
    auVar209._4_4_ = uVar70;
    auVar209._0_4_ = uVar70;
    auVar209._8_4_ = uVar70;
    auVar209._12_4_ = uVar70;
    auVar301 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar6,auVar209);
    uVar70 = local_3d0._0_4_;
    auVar210._4_4_ = uVar70;
    auVar210._0_4_ = uVar70;
    auVar210._8_4_ = uVar70;
    auVar210._12_4_ = uVar70;
    auVar107 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar6,auVar210);
    uVar70 = local_3e0._0_4_;
    auVar211._4_4_ = uVar70;
    auVar211._0_4_ = uVar70;
    auVar211._8_4_ = uVar70;
    auVar211._12_4_ = uVar70;
    auVar108 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar6,auVar211);
    uVar70 = local_3f0._0_4_;
    auVar212._4_4_ = uVar70;
    auVar212._0_4_ = uVar70;
    auVar212._8_4_ = uVar70;
    auVar212._12_4_ = uVar70;
    auVar72 = vfmadd231ps_fma(auVar72,(undefined1  [16])aVar6,auVar212);
    uVar70 = local_400._0_4_;
    auVar213._4_4_ = uVar70;
    auVar213._0_4_ = uVar70;
    auVar213._8_4_ = uVar70;
    auVar213._12_4_ = uVar70;
    auVar109 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar6,auVar213);
    uVar70 = local_410._0_4_;
    auVar214._4_4_ = uVar70;
    auVar214._0_4_ = uVar70;
    auVar214._8_4_ = uVar70;
    auVar214._12_4_ = uVar70;
    auVar132 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar6,auVar214);
    auVar19 = vmovlhps_avx(auVar73,auVar108);
    auVar20 = vmovlhps_avx(auVar71,auVar72);
    auVar188 = vmovlhps_avx(auVar301,auVar109);
    auVar21 = vmovlhps_avx(auVar107,auVar132);
    auVar16 = vminps_avx(auVar19,auVar20);
    auVar17 = vminps_avx(auVar188,auVar21);
    auVar160 = vminps_avx(auVar16,auVar17);
    auVar16 = vmaxps_avx(auVar19,auVar20);
    auVar17 = vmaxps_avx(auVar188,auVar21);
    auVar16 = vmaxps_avx(auVar16,auVar17);
    auVar17 = vshufpd_avx(auVar160,auVar160,3);
    auVar160 = vminps_avx(auVar160,auVar17);
    auVar17 = vshufpd_avx(auVar16,auVar16,3);
    auVar17 = vmaxps_avx(auVar16,auVar17);
    auVar16 = vandps_avx(local_4c0,auVar160);
    auVar17 = vandps_avx(auVar17,local_4c0);
    auVar16 = vmaxps_avx(auVar16,auVar17);
    auVar17 = vmovshdup_avx(auVar16);
    auVar16 = vmaxss_avx(auVar17,auVar16);
    local_568 = uVar57 + 0xf;
    fVar103 = auVar16._0_4_ * 9.536743e-07;
    auVar253._8_8_ = auVar73._0_8_;
    auVar253._0_8_ = auVar73._0_8_;
    auVar282._8_8_ = auVar71._0_8_;
    auVar282._0_8_ = auVar71._0_8_;
    auVar313._0_8_ = auVar301._0_8_;
    auVar313._8_8_ = auVar313._0_8_;
    auVar324._0_8_ = auVar107._0_8_;
    auVar324._8_8_ = auVar324._0_8_;
    local_380 = fVar103;
    fStack_37c = fVar103;
    fStack_378 = fVar103;
    fStack_374 = fVar103;
    fStack_370 = fVar103;
    fStack_36c = fVar103;
    fStack_368 = fVar103;
    fStack_364 = fVar103;
    fStack_1b8 = -fVar103;
    local_1c0 = -fVar103;
    fStack_1bc = -fVar103;
    fStack_1b4 = fStack_1b8;
    fStack_1b0 = fStack_1b8;
    fStack_1ac = fStack_1b8;
    fStack_1a8 = fStack_1b8;
    fStack_1a4 = fStack_1b8;
    local_300 = uVar59;
    uStack_2fc = uVar59;
    uStack_2f8 = uVar59;
    uStack_2f4 = uVar59;
    uStack_2f0 = uVar59;
    uStack_2ec = uVar59;
    uStack_2e8 = uVar59;
    uStack_2e4 = uVar59;
    local_320 = uVar8;
    uStack_31c = uVar8;
    uStack_318 = uVar8;
    uStack_314 = uVar8;
    uStack_310 = uVar8;
    uStack_30c = uVar8;
    uStack_308 = uVar8;
    uStack_304 = uVar8;
    uVar67 = 0;
    fVar68 = *(float *)(ray + k * 4 + 0x60);
    local_390 = vsubps_avx(auVar20,auVar19);
    local_3a0 = vsubps_avx(auVar188,auVar20);
    local_3b0 = vsubps_avx(auVar21,auVar188);
    local_430 = vsubps_avx(_local_510,local_4f0);
    local_440 = vsubps_avx(auVar23,auVar22);
    local_450 = vsubps_avx(auVar135,local_500);
    _local_460 = vsubps_avx(auVar150,auVar115);
    auVar201 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar297 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_017391f9:
    local_420 = auVar297._0_16_;
    auVar190 = auVar201._0_16_;
    auVar16 = vshufps_avx(auVar190,auVar190,0x50);
    auVar333._8_4_ = 0x3f800000;
    auVar333._0_8_ = 0x3f8000003f800000;
    auVar333._12_4_ = 0x3f800000;
    auVar336._16_4_ = 0x3f800000;
    auVar336._0_16_ = auVar333;
    auVar336._20_4_ = 0x3f800000;
    auVar336._24_4_ = 0x3f800000;
    auVar336._28_4_ = 0x3f800000;
    auVar17 = vsubps_avx(auVar333,auVar16);
    fVar104 = auVar16._0_4_;
    fVar245 = auVar108._0_4_;
    auVar86._0_4_ = fVar245 * fVar104;
    fVar147 = auVar16._4_4_;
    fVar261 = auVar108._4_4_;
    auVar86._4_4_ = fVar261 * fVar147;
    fVar69 = auVar16._8_4_;
    auVar86._8_4_ = fVar245 * fVar69;
    fVar146 = auVar16._12_4_;
    auVar86._12_4_ = fVar261 * fVar146;
    fVar262 = auVar72._0_4_;
    auVar215._0_4_ = fVar262 * fVar104;
    fVar221 = auVar72._4_4_;
    auVar215._4_4_ = fVar221 * fVar147;
    auVar215._8_4_ = fVar262 * fVar69;
    auVar215._12_4_ = fVar221 * fVar146;
    fVar222 = auVar109._0_4_;
    auVar177._0_4_ = fVar222 * fVar104;
    fVar238 = auVar109._4_4_;
    auVar177._4_4_ = fVar238 * fVar147;
    auVar177._8_4_ = fVar222 * fVar69;
    auVar177._12_4_ = fVar238 * fVar146;
    fVar264 = auVar132._0_4_;
    auVar138._0_4_ = fVar264 * fVar104;
    fVar277 = auVar132._4_4_;
    auVar138._4_4_ = fVar277 * fVar147;
    auVar138._8_4_ = fVar264 * fVar69;
    auVar138._12_4_ = fVar277 * fVar146;
    auVar71 = vfmadd231ps_fma(auVar86,auVar17,auVar253);
    auVar301 = vfmadd231ps_fma(auVar215,auVar17,auVar282);
    auVar107 = vfmadd231ps_fma(auVar177,auVar17,auVar313);
    auVar133 = vfmadd231ps_fma(auVar138,auVar324,auVar17);
    auVar16 = vmovshdup_avx(auVar297._0_16_);
    fVar104 = auVar297._0_4_;
    fStack_268 = (auVar16._0_4_ - fVar104) * 0.04761905;
    auVar276._4_4_ = fVar104;
    auVar276._0_4_ = fVar104;
    auVar276._8_4_ = fVar104;
    auVar276._12_4_ = fVar104;
    auVar276._16_4_ = fVar104;
    auVar276._20_4_ = fVar104;
    auVar276._24_4_ = fVar104;
    auVar276._28_4_ = fVar104;
    auVar128._0_8_ = auVar16._0_8_;
    auVar128._8_8_ = auVar128._0_8_;
    auVar128._16_8_ = auVar128._0_8_;
    auVar128._24_8_ = auVar128._0_8_;
    auVar98 = vsubps_avx(auVar128,auVar276);
    uVar70 = auVar71._0_4_;
    auVar328._4_4_ = uVar70;
    auVar328._0_4_ = uVar70;
    auVar328._8_4_ = uVar70;
    auVar328._12_4_ = uVar70;
    auVar328._16_4_ = uVar70;
    auVar328._20_4_ = uVar70;
    auVar328._24_4_ = uVar70;
    auVar328._28_4_ = uVar70;
    auVar16 = vmovshdup_avx(auVar71);
    uVar106 = auVar16._0_8_;
    auVar319._8_8_ = uVar106;
    auVar319._0_8_ = uVar106;
    auVar319._16_8_ = uVar106;
    auVar319._24_8_ = uVar106;
    fVar263 = auVar301._0_4_;
    auVar307._4_4_ = fVar263;
    auVar307._0_4_ = fVar263;
    auVar307._8_4_ = fVar263;
    auVar307._12_4_ = fVar263;
    auVar307._16_4_ = fVar263;
    auVar307._20_4_ = fVar263;
    auVar307._24_4_ = fVar263;
    auVar307._28_4_ = fVar263;
    auVar17 = vmovshdup_avx(auVar301);
    auVar129._0_8_ = auVar17._0_8_;
    auVar129._8_8_ = auVar129._0_8_;
    auVar129._16_8_ = auVar129._0_8_;
    auVar129._24_8_ = auVar129._0_8_;
    fVar169 = auVar107._0_4_;
    auVar235._4_4_ = fVar169;
    auVar235._0_4_ = fVar169;
    auVar235._8_4_ = fVar169;
    auVar235._12_4_ = fVar169;
    auVar235._16_4_ = fVar169;
    auVar235._20_4_ = fVar169;
    auVar235._24_4_ = fVar169;
    auVar235._28_4_ = fVar169;
    auVar160 = vmovshdup_avx(auVar107);
    auVar259._0_8_ = auVar160._0_8_;
    auVar259._8_8_ = auVar259._0_8_;
    auVar259._16_8_ = auVar259._0_8_;
    auVar259._24_8_ = auVar259._0_8_;
    fVar168 = auVar133._0_4_;
    auVar73 = vmovshdup_avx(auVar133);
    auVar293 = vfmadd132ps_fma(auVar98,auVar276,_DAT_01faff20);
    auVar98 = vsubps_avx(auVar336,ZEXT1632(auVar293));
    fVar104 = auVar293._0_4_;
    fVar147 = auVar293._4_4_;
    auVar25._4_4_ = fVar263 * fVar147;
    auVar25._0_4_ = fVar263 * fVar104;
    fVar69 = auVar293._8_4_;
    auVar25._8_4_ = fVar263 * fVar69;
    fVar146 = auVar293._12_4_;
    auVar25._12_4_ = fVar263 * fVar146;
    auVar25._16_4_ = fVar263 * 0.0;
    auVar25._20_4_ = fVar263 * 0.0;
    auVar25._24_4_ = fVar263 * 0.0;
    auVar25._28_4_ = 0x3f800000;
    auVar293 = vfmadd231ps_fma(auVar25,auVar98,auVar328);
    fVar145 = auVar17._0_4_;
    fVar167 = auVar17._4_4_;
    auVar24._4_4_ = fVar167 * fVar147;
    auVar24._0_4_ = fVar145 * fVar104;
    auVar24._8_4_ = fVar145 * fVar69;
    auVar24._12_4_ = fVar167 * fVar146;
    auVar24._16_4_ = fVar145 * 0.0;
    auVar24._20_4_ = fVar167 * 0.0;
    auVar24._24_4_ = fVar145 * 0.0;
    auVar24._28_4_ = uVar70;
    auVar134 = vfmadd231ps_fma(auVar24,auVar98,auVar319);
    auVar18._4_4_ = fVar169 * fVar147;
    auVar18._0_4_ = fVar169 * fVar104;
    auVar18._8_4_ = fVar169 * fVar69;
    auVar18._12_4_ = fVar169 * fVar146;
    auVar18._16_4_ = fVar169 * 0.0;
    auVar18._20_4_ = fVar169 * 0.0;
    auVar18._24_4_ = fVar169 * 0.0;
    auVar18._28_4_ = auVar16._4_4_;
    auVar170 = vfmadd231ps_fma(auVar18,auVar98,auVar307);
    fVar145 = auVar160._0_4_;
    fVar167 = auVar160._4_4_;
    auVar26._4_4_ = fVar167 * fVar147;
    auVar26._0_4_ = fVar145 * fVar104;
    auVar26._8_4_ = fVar145 * fVar69;
    auVar26._12_4_ = fVar167 * fVar146;
    auVar26._16_4_ = fVar145 * 0.0;
    auVar26._20_4_ = fVar167 * 0.0;
    auVar26._24_4_ = fVar145 * 0.0;
    auVar26._28_4_ = fVar263;
    auVar157 = vfmadd231ps_fma(auVar26,auVar98,auVar129);
    auVar16 = vshufps_avx(auVar71,auVar71,0xaa);
    uStack_698 = auVar16._0_8_;
    local_6a0 = (undefined1  [8])uStack_698;
    uStack_690 = uStack_698;
    uStack_688 = uStack_698;
    auVar17 = vshufps_avx(auVar71,auVar71,0xff);
    uStack_758 = auVar17._0_8_;
    local_760 = (undefined1  [8])uStack_758;
    uStack_750 = uStack_758;
    uStack_748 = uStack_758;
    auVar27._4_4_ = fVar168 * fVar147;
    auVar27._0_4_ = fVar168 * fVar104;
    auVar27._8_4_ = fVar168 * fVar69;
    auVar27._12_4_ = fVar168 * fVar146;
    auVar27._16_4_ = fVar168 * 0.0;
    auVar27._20_4_ = fVar168 * 0.0;
    auVar27._24_4_ = fVar168 * 0.0;
    auVar27._28_4_ = fVar168;
    auVar71 = vfmadd231ps_fma(auVar27,auVar98,auVar235);
    auVar17 = vshufps_avx(auVar301,auVar301,0xaa);
    auVar236._0_8_ = auVar17._0_8_;
    auVar236._8_8_ = auVar236._0_8_;
    auVar236._16_8_ = auVar236._0_8_;
    auVar236._24_8_ = auVar236._0_8_;
    auVar160 = vshufps_avx(auVar301,auVar301,0xff);
    local_620._8_8_ = auVar160._0_8_;
    local_620._0_8_ = local_620._8_8_;
    local_620._16_8_ = local_620._8_8_;
    local_620._24_8_ = local_620._8_8_;
    fVar145 = auVar73._0_4_;
    fVar167 = auVar73._4_4_;
    auVar28._4_4_ = fVar167 * fVar147;
    auVar28._0_4_ = fVar145 * fVar104;
    auVar28._8_4_ = fVar145 * fVar69;
    auVar28._12_4_ = fVar167 * fVar146;
    auVar28._16_4_ = fVar145 * 0.0;
    auVar28._20_4_ = fVar167 * 0.0;
    auVar28._24_4_ = fVar145 * 0.0;
    auVar28._28_4_ = auVar16._4_4_;
    auVar202 = vfmadd231ps_fma(auVar28,auVar98,auVar259);
    auVar29._28_4_ = fVar167;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(auVar170._12_4_ * fVar146,
                            CONCAT48(auVar170._8_4_ * fVar69,
                                     CONCAT44(auVar170._4_4_ * fVar147,auVar170._0_4_ * fVar104))));
    auVar293 = vfmadd231ps_fma(auVar29,auVar98,ZEXT1632(auVar293));
    fVar145 = auVar160._4_4_;
    auVar30._28_4_ = fVar145;
    auVar30._0_28_ =
         ZEXT1628(CONCAT412(auVar157._12_4_ * fVar146,
                            CONCAT48(auVar157._8_4_ * fVar69,
                                     CONCAT44(auVar157._4_4_ * fVar147,auVar157._0_4_ * fVar104))));
    auVar134 = vfmadd231ps_fma(auVar30,auVar98,ZEXT1632(auVar134));
    auVar16 = vshufps_avx(auVar107,auVar107,0xaa);
    uVar106 = auVar16._0_8_;
    auVar220._8_8_ = uVar106;
    auVar220._0_8_ = uVar106;
    auVar220._16_8_ = uVar106;
    auVar220._24_8_ = uVar106;
    auVar73 = vshufps_avx(auVar107,auVar107,0xff);
    uVar106 = auVar73._0_8_;
    auVar337._8_8_ = uVar106;
    auVar337._0_8_ = uVar106;
    auVar337._16_8_ = uVar106;
    auVar337._24_8_ = uVar106;
    auVar107 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar71._12_4_ * fVar146,
                                                  CONCAT48(auVar71._8_4_ * fVar69,
                                                           CONCAT44(auVar71._4_4_ * fVar147,
                                                                    auVar71._0_4_ * fVar104)))),
                               auVar98,ZEXT1632(auVar170));
    auVar71 = vshufps_avx(auVar133,auVar133,0xaa);
    auVar301 = vshufps_avx(auVar133,auVar133,0xff);
    auVar133 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar146 * auVar202._12_4_,
                                                  CONCAT48(fVar69 * auVar202._8_4_,
                                                           CONCAT44(fVar147 * auVar202._4_4_,
                                                                    fVar104 * auVar202._0_4_)))),
                               auVar98,ZEXT1632(auVar157));
    auVar170 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar146 * auVar107._12_4_,
                                                  CONCAT48(fVar69 * auVar107._8_4_,
                                                           CONCAT44(fVar147 * auVar107._4_4_,
                                                                    fVar104 * auVar107._0_4_)))),
                               auVar98,ZEXT1632(auVar293));
    auVar25 = vsubps_avx(ZEXT1632(auVar107),ZEXT1632(auVar293));
    auVar107 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar146 * auVar133._12_4_,
                                                  CONCAT48(fVar69 * auVar133._8_4_,
                                                           CONCAT44(fVar147 * auVar133._4_4_,
                                                                    fVar104 * auVar133._0_4_)))),
                               auVar98,ZEXT1632(auVar134));
    auVar99 = vsubps_avx(ZEXT1632(auVar133),ZEXT1632(auVar134));
    fStack_5e4 = auVar99._28_4_;
    auVar308._0_4_ = fStack_268 * auVar25._0_4_ * 3.0;
    auVar308._4_4_ = fStack_268 * auVar25._4_4_ * 3.0;
    auVar308._8_4_ = fStack_268 * auVar25._8_4_ * 3.0;
    auVar308._12_4_ = fStack_268 * auVar25._12_4_ * 3.0;
    auVar308._16_4_ = fStack_268 * auVar25._16_4_ * 3.0;
    auVar308._20_4_ = fStack_268 * auVar25._20_4_ * 3.0;
    auVar308._24_4_ = fStack_268 * auVar25._24_4_ * 3.0;
    auVar308._28_4_ = 0;
    local_600._0_4_ = fStack_268 * auVar99._0_4_ * 3.0;
    local_600._4_4_ = fStack_268 * auVar99._4_4_ * 3.0;
    fStack_5f8 = fStack_268 * auVar99._8_4_ * 3.0;
    fStack_5f4 = fStack_268 * auVar99._12_4_ * 3.0;
    fStack_5f0 = fStack_268 * auVar99._16_4_ * 3.0;
    fStack_5ec = fStack_268 * auVar99._20_4_ * 3.0;
    fStack_5e8 = fStack_268 * auVar99._24_4_ * 3.0;
    fVar167 = auVar17._0_4_;
    fVar168 = auVar17._4_4_;
    auVar309._4_4_ = fVar168 * fVar147;
    auVar309._0_4_ = fVar167 * fVar104;
    auVar309._8_4_ = fVar167 * fVar69;
    auVar309._12_4_ = fVar168 * fVar146;
    auVar309._16_4_ = fVar167 * 0.0;
    auVar309._20_4_ = fVar168 * 0.0;
    auVar309._24_4_ = fVar167 * 0.0;
    auVar309._28_4_ = fStack_5e4;
    auVar17 = vfmadd231ps_fma(auVar309,auVar98,_local_6a0);
    fVar167 = auVar160._0_4_;
    auVar31._4_4_ = fVar145 * fVar147;
    auVar31._0_4_ = fVar167 * fVar104;
    auVar31._8_4_ = fVar167 * fVar69;
    auVar31._12_4_ = fVar145 * fVar146;
    auVar31._16_4_ = fVar167 * 0.0;
    auVar31._20_4_ = fVar145 * 0.0;
    auVar31._24_4_ = fVar167 * 0.0;
    auVar31._28_4_ = 0;
    auVar160 = vfmadd231ps_fma(auVar31,auVar98,_local_760);
    fVar145 = auVar16._0_4_;
    fVar167 = auVar16._4_4_;
    auVar32._4_4_ = fVar167 * fVar147;
    auVar32._0_4_ = fVar145 * fVar104;
    auVar32._8_4_ = fVar145 * fVar69;
    auVar32._12_4_ = fVar167 * fVar146;
    auVar32._16_4_ = fVar145 * 0.0;
    auVar32._20_4_ = fVar167 * 0.0;
    auVar32._24_4_ = fVar145 * 0.0;
    auVar32._28_4_ = auVar25._28_4_;
    auVar16 = vfmadd231ps_fma(auVar32,auVar98,auVar236);
    fVar145 = auVar73._0_4_;
    fVar169 = auVar73._4_4_;
    auVar33._4_4_ = fVar169 * fVar147;
    auVar33._0_4_ = fVar145 * fVar104;
    auVar33._8_4_ = fVar145 * fVar69;
    auVar33._12_4_ = fVar169 * fVar146;
    auVar33._16_4_ = fVar145 * 0.0;
    auVar33._20_4_ = fVar169 * 0.0;
    auVar33._24_4_ = fVar145 * 0.0;
    auVar33._28_4_ = fVar168;
    auVar73 = vfmadd231ps_fma(auVar33,auVar98,local_620);
    auVar26 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar170));
    fVar145 = auVar71._0_4_;
    fVar167 = auVar71._4_4_;
    auVar34._4_4_ = fVar167 * fVar147;
    auVar34._0_4_ = fVar145 * fVar104;
    auVar34._8_4_ = fVar145 * fVar69;
    auVar34._12_4_ = fVar167 * fVar146;
    auVar34._16_4_ = fVar145 * 0.0;
    auVar34._20_4_ = fVar167 * 0.0;
    auVar34._24_4_ = fVar145 * 0.0;
    auVar34._28_4_ = fVar167;
    auVar71 = vfmadd231ps_fma(auVar34,auVar98,auVar220);
    auVar27 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar107));
    fVar145 = auVar301._0_4_;
    fVar167 = auVar301._4_4_;
    auVar35._4_4_ = fVar167 * fVar147;
    auVar35._0_4_ = fVar145 * fVar104;
    auVar35._8_4_ = fVar145 * fVar69;
    auVar35._12_4_ = fVar167 * fVar146;
    auVar35._16_4_ = fVar145 * 0.0;
    auVar35._20_4_ = fVar167 * 0.0;
    auVar35._24_4_ = fVar145 * 0.0;
    auVar35._28_4_ = fVar167;
    auVar301 = vfmadd231ps_fma(auVar35,auVar98,auVar337);
    auVar36._28_4_ = fVar169;
    auVar36._0_28_ =
         ZEXT1628(CONCAT412(auVar16._12_4_ * fVar146,
                            CONCAT48(auVar16._8_4_ * fVar69,
                                     CONCAT44(auVar16._4_4_ * fVar147,auVar16._0_4_ * fVar104))));
    auVar17 = vfmadd231ps_fma(auVar36,auVar98,ZEXT1632(auVar17));
    auVar160 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar146 * auVar73._12_4_,
                                                  CONCAT48(fVar69 * auVar73._8_4_,
                                                           CONCAT44(fVar147 * auVar73._4_4_,
                                                                    fVar104 * auVar73._0_4_)))),
                               auVar98,ZEXT1632(auVar160));
    auVar130._0_4_ = auVar170._0_4_ + auVar308._0_4_;
    auVar130._4_4_ = auVar170._4_4_ + auVar308._4_4_;
    auVar130._8_4_ = auVar170._8_4_ + auVar308._8_4_;
    auVar130._12_4_ = auVar170._12_4_ + auVar308._12_4_;
    auVar130._16_4_ = auVar308._16_4_ + 0.0;
    auVar130._20_4_ = auVar308._20_4_ + 0.0;
    auVar130._24_4_ = auVar308._24_4_ + 0.0;
    auVar130._28_4_ = 0;
    auVar16 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar71._12_4_ * fVar146,
                                                 CONCAT48(auVar71._8_4_ * fVar69,
                                                          CONCAT44(auVar71._4_4_ * fVar147,
                                                                   auVar71._0_4_ * fVar104)))),
                              auVar98,ZEXT1632(auVar16));
    auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar301._12_4_ * fVar146,
                                                 CONCAT48(auVar301._8_4_ * fVar69,
                                                          CONCAT44(auVar301._4_4_ * fVar147,
                                                                   auVar301._0_4_ * fVar104)))),
                              auVar98,ZEXT1632(auVar73));
    auVar71 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar146 * auVar16._12_4_,
                                                 CONCAT48(fVar69 * auVar16._8_4_,
                                                          CONCAT44(fVar147 * auVar16._4_4_,
                                                                   fVar104 * auVar16._0_4_)))),
                              auVar98,ZEXT1632(auVar17));
    auVar301 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar73._12_4_ * fVar146,
                                                  CONCAT48(auVar73._8_4_ * fVar69,
                                                           CONCAT44(auVar73._4_4_ * fVar147,
                                                                    auVar73._0_4_ * fVar104)))),
                               ZEXT1632(auVar160),auVar98);
    auVar98 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
    auVar25 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar160));
    auVar329._0_4_ = fStack_268 * auVar98._0_4_ * 3.0;
    auVar329._4_4_ = fStack_268 * auVar98._4_4_ * 3.0;
    auVar329._8_4_ = fStack_268 * auVar98._8_4_ * 3.0;
    auVar329._12_4_ = fStack_268 * auVar98._12_4_ * 3.0;
    auVar329._16_4_ = fStack_268 * auVar98._16_4_ * 3.0;
    auVar329._20_4_ = fStack_268 * auVar98._20_4_ * 3.0;
    auVar329._24_4_ = fStack_268 * auVar98._24_4_ * 3.0;
    auVar329._28_4_ = 0;
    local_280 = fStack_268 * auVar25._0_4_ * 3.0;
    fStack_27c = fStack_268 * auVar25._4_4_ * 3.0;
    auVar37._4_4_ = fStack_27c;
    auVar37._0_4_ = local_280;
    fStack_278 = fStack_268 * auVar25._8_4_ * 3.0;
    auVar37._8_4_ = fStack_278;
    fStack_274 = fStack_268 * auVar25._12_4_ * 3.0;
    auVar37._12_4_ = fStack_274;
    fStack_270 = fStack_268 * auVar25._16_4_ * 3.0;
    auVar37._16_4_ = fStack_270;
    fStack_26c = fStack_268 * auVar25._20_4_ * 3.0;
    auVar37._20_4_ = fStack_26c;
    fStack_268 = fStack_268 * auVar25._24_4_ * 3.0;
    auVar37._24_4_ = fStack_268;
    auVar37._28_4_ = 0x40400000;
    auVar28 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar71));
    auVar29 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar301));
    auVar98 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar170));
    auVar25 = vsubps_avx(ZEXT1632(auVar301),ZEXT1632(auVar107));
    auVar99 = vsubps_avx(auVar28,auVar26);
    fVar263 = auVar98._0_4_ + auVar99._0_4_;
    fVar239 = auVar98._4_4_ + auVar99._4_4_;
    fVar240 = auVar98._8_4_ + auVar99._8_4_;
    fVar241 = auVar98._12_4_ + auVar99._12_4_;
    fVar242 = auVar98._16_4_ + auVar99._16_4_;
    fVar243 = auVar98._20_4_ + auVar99._20_4_;
    fVar244 = auVar98._24_4_ + auVar99._24_4_;
    auVar24 = vsubps_avx(auVar29,auVar27);
    auVar100._0_4_ = auVar25._0_4_ + auVar24._0_4_;
    auVar100._4_4_ = auVar25._4_4_ + auVar24._4_4_;
    auVar100._8_4_ = auVar25._8_4_ + auVar24._8_4_;
    auVar100._12_4_ = auVar25._12_4_ + auVar24._12_4_;
    auVar100._16_4_ = auVar25._16_4_ + auVar24._16_4_;
    auVar100._20_4_ = auVar25._20_4_ + auVar24._20_4_;
    auVar100._24_4_ = auVar25._24_4_ + auVar24._24_4_;
    auVar100._28_4_ = auVar25._28_4_ + auVar24._28_4_;
    local_220 = ZEXT1632(auVar107);
    fVar104 = auVar107._0_4_;
    local_2a0 = (float)local_600._0_4_ + fVar104;
    fVar147 = auVar107._4_4_;
    fStack_29c = (float)local_600._4_4_ + fVar147;
    fVar69 = auVar107._8_4_;
    fStack_298 = fStack_5f8 + fVar69;
    fVar146 = auVar107._12_4_;
    fStack_294 = fStack_5f4 + fVar146;
    fStack_290 = fStack_5f0 + 0.0;
    fStack_28c = fStack_5ec + 0.0;
    fStack_288 = fStack_5e8 + 0.0;
    local_1e0 = ZEXT1632(auVar170);
    auVar25 = vsubps_avx(local_1e0,auVar308);
    local_200 = vpermps_avx2(_DAT_01fec480,auVar25);
    auVar25 = vsubps_avx(local_220,_local_600);
    local_2c0 = vpermps_avx2(_DAT_01fec480,auVar25);
    local_240._0_4_ = auVar71._0_4_ + auVar329._0_4_;
    local_240._4_4_ = auVar71._4_4_ + auVar329._4_4_;
    local_240._8_4_ = auVar71._8_4_ + auVar329._8_4_;
    local_240._12_4_ = auVar71._12_4_ + auVar329._12_4_;
    local_240._16_4_ = auVar329._16_4_ + 0.0;
    local_240._20_4_ = auVar329._20_4_ + 0.0;
    local_240._24_4_ = auVar329._24_4_ + 0.0;
    local_240._28_4_ = 0;
    auVar309 = ZEXT1632(auVar71);
    auVar25 = vsubps_avx(auVar309,auVar329);
    auVar30 = vpermps_avx2(_DAT_01fec480,auVar25);
    fVar145 = auVar301._0_4_;
    local_280 = fVar145 + local_280;
    fVar167 = auVar301._4_4_;
    fStack_27c = fVar167 + fStack_27c;
    fVar168 = auVar301._8_4_;
    fStack_278 = fVar168 + fStack_278;
    fVar169 = auVar301._12_4_;
    fStack_274 = fVar169 + fStack_274;
    fStack_270 = fStack_270 + 0.0;
    fStack_26c = fStack_26c + 0.0;
    fStack_268 = fStack_268 + 0.0;
    auVar25 = vsubps_avx(ZEXT1632(auVar301),auVar37);
    local_260 = vpermps_avx2(_DAT_01fec480,auVar25);
    auVar38._4_4_ = fVar147 * fVar239;
    auVar38._0_4_ = fVar104 * fVar263;
    auVar38._8_4_ = fVar69 * fVar240;
    auVar38._12_4_ = fVar146 * fVar241;
    auVar38._16_4_ = fVar242 * 0.0;
    auVar38._20_4_ = fVar243 * 0.0;
    auVar38._24_4_ = fVar244 * 0.0;
    auVar38._28_4_ = auVar25._28_4_;
    auVar16 = vfnmadd231ps_fma(auVar38,local_1e0,auVar100);
    fStack_284 = fStack_5e4 + 0.0;
    auVar39._4_4_ = fStack_29c * fVar239;
    auVar39._0_4_ = local_2a0 * fVar263;
    auVar39._8_4_ = fStack_298 * fVar240;
    auVar39._12_4_ = fStack_294 * fVar241;
    auVar39._16_4_ = fStack_290 * fVar242;
    auVar39._20_4_ = fStack_28c * fVar243;
    auVar39._24_4_ = fStack_288 * fVar244;
    auVar39._28_4_ = 0;
    auVar17 = vfnmadd231ps_fma(auVar39,auVar100,auVar130);
    auVar40._4_4_ = local_2c0._4_4_ * fVar239;
    auVar40._0_4_ = local_2c0._0_4_ * fVar263;
    auVar40._8_4_ = local_2c0._8_4_ * fVar240;
    auVar40._12_4_ = local_2c0._12_4_ * fVar241;
    auVar40._16_4_ = local_2c0._16_4_ * fVar242;
    auVar40._20_4_ = local_2c0._20_4_ * fVar243;
    auVar40._24_4_ = local_2c0._24_4_ * fVar244;
    auVar40._28_4_ = fStack_5e4 + 0.0;
    auVar160 = vfnmadd231ps_fma(auVar40,local_200,auVar100);
    local_760._0_4_ = auVar27._0_4_;
    local_760._4_4_ = auVar27._4_4_;
    uStack_758._0_4_ = auVar27._8_4_;
    uStack_758._4_4_ = auVar27._12_4_;
    uStack_750._0_4_ = auVar27._16_4_;
    uStack_750._4_4_ = auVar27._20_4_;
    uStack_748._0_4_ = auVar27._24_4_;
    uStack_748._4_4_ = auVar27._28_4_;
    auVar41._4_4_ = (float)local_760._4_4_ * fVar239;
    auVar41._0_4_ = (float)local_760._0_4_ * fVar263;
    auVar41._8_4_ = (float)uStack_758 * fVar240;
    auVar41._12_4_ = uStack_758._4_4_ * fVar241;
    auVar41._16_4_ = (float)uStack_750 * fVar242;
    auVar41._20_4_ = uStack_750._4_4_ * fVar243;
    auVar41._24_4_ = (float)uStack_748 * fVar244;
    auVar41._28_4_ = uStack_748._4_4_;
    auVar73 = vfnmadd231ps_fma(auVar41,auVar26,auVar100);
    auVar260._0_4_ = fVar145 * fVar263;
    auVar260._4_4_ = fVar167 * fVar239;
    auVar260._8_4_ = fVar168 * fVar240;
    auVar260._12_4_ = fVar169 * fVar241;
    auVar260._16_4_ = fVar242 * 0.0;
    auVar260._20_4_ = fVar243 * 0.0;
    auVar260._24_4_ = fVar244 * 0.0;
    auVar260._28_4_ = 0;
    auVar71 = vfnmadd231ps_fma(auVar260,auVar309,auVar100);
    uStack_264 = 0x40400000;
    auVar42._4_4_ = fStack_27c * fVar239;
    auVar42._0_4_ = local_280 * fVar263;
    auVar42._8_4_ = fStack_278 * fVar240;
    auVar42._12_4_ = fStack_274 * fVar241;
    auVar42._16_4_ = fStack_270 * fVar242;
    auVar42._20_4_ = fStack_26c * fVar243;
    auVar42._24_4_ = fStack_268 * fVar244;
    auVar42._28_4_ = auVar26._28_4_;
    auVar107 = vfnmadd231ps_fma(auVar42,local_240,auVar100);
    auVar43._4_4_ = local_260._4_4_ * fVar239;
    auVar43._0_4_ = local_260._0_4_ * fVar263;
    auVar43._8_4_ = local_260._8_4_ * fVar240;
    auVar43._12_4_ = local_260._12_4_ * fVar241;
    auVar43._16_4_ = local_260._16_4_ * fVar242;
    auVar43._20_4_ = local_260._20_4_ * fVar243;
    auVar43._24_4_ = local_260._24_4_ * fVar244;
    auVar43._28_4_ = local_260._28_4_;
    auVar133 = vfnmadd231ps_fma(auVar43,auVar30,auVar100);
    auVar44._4_4_ = auVar29._4_4_ * fVar239;
    auVar44._0_4_ = auVar29._0_4_ * fVar263;
    auVar44._8_4_ = auVar29._8_4_ * fVar240;
    auVar44._12_4_ = auVar29._12_4_ * fVar241;
    auVar44._16_4_ = auVar29._16_4_ * fVar242;
    auVar44._20_4_ = auVar29._20_4_ * fVar243;
    auVar44._24_4_ = auVar29._24_4_ * fVar244;
    auVar44._28_4_ = auVar98._28_4_ + auVar99._28_4_;
    auVar293 = vfnmadd231ps_fma(auVar44,auVar28,auVar100);
    auVar25 = vminps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
    auVar98 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
    auVar99 = vminps_avx(ZEXT1632(auVar160),ZEXT1632(auVar73));
    auVar99 = vminps_avx(auVar25,auVar99);
    auVar25 = vmaxps_avx(ZEXT1632(auVar160),ZEXT1632(auVar73));
    auVar98 = vmaxps_avx(auVar98,auVar25);
    auVar24 = vminps_avx(ZEXT1632(auVar71),ZEXT1632(auVar107));
    auVar25 = vmaxps_avx(ZEXT1632(auVar71),ZEXT1632(auVar107));
    auVar18 = vminps_avx(ZEXT1632(auVar133),ZEXT1632(auVar293));
    auVar24 = vminps_avx(auVar24,auVar18);
    auVar24 = vminps_avx(auVar99,auVar24);
    auVar99 = vmaxps_avx(ZEXT1632(auVar133),ZEXT1632(auVar293));
    auVar25 = vmaxps_avx(auVar25,auVar99);
    auVar25 = vmaxps_avx(auVar98,auVar25);
    auVar53._4_4_ = fStack_37c;
    auVar53._0_4_ = local_380;
    auVar53._8_4_ = fStack_378;
    auVar53._12_4_ = fStack_374;
    auVar53._16_4_ = fStack_370;
    auVar53._20_4_ = fStack_36c;
    auVar53._24_4_ = fStack_368;
    auVar53._28_4_ = fStack_364;
    auVar98 = vcmpps_avx(auVar24,auVar53,2);
    auVar55._4_4_ = fStack_1bc;
    auVar55._0_4_ = local_1c0;
    auVar55._8_4_ = fStack_1b8;
    auVar55._12_4_ = fStack_1b4;
    auVar55._16_4_ = fStack_1b0;
    auVar55._20_4_ = fStack_1ac;
    auVar55._24_4_ = fStack_1a8;
    auVar55._28_4_ = fStack_1a4;
    auVar25 = vcmpps_avx(auVar25,auVar55,5);
    auVar98 = vandps_avx(auVar25,auVar98);
    auVar25 = local_2e0 & auVar98;
    if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0x7f,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0xbf,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0')
    {
      auVar25 = vsubps_avx(auVar26,local_1e0);
      auVar99 = vsubps_avx(auVar28,auVar309);
      fVar239 = auVar25._0_4_ + auVar99._0_4_;
      fVar240 = auVar25._4_4_ + auVar99._4_4_;
      fVar241 = auVar25._8_4_ + auVar99._8_4_;
      fVar242 = auVar25._12_4_ + auVar99._12_4_;
      fVar243 = auVar25._16_4_ + auVar99._16_4_;
      fVar244 = auVar25._20_4_ + auVar99._20_4_;
      fVar105 = auVar25._24_4_ + auVar99._24_4_;
      auVar24 = vsubps_avx(auVar27,local_220);
      auVar18 = vsubps_avx(auVar29,ZEXT1632(auVar301));
      auVar131._0_4_ = auVar24._0_4_ + auVar18._0_4_;
      auVar131._4_4_ = auVar24._4_4_ + auVar18._4_4_;
      auVar131._8_4_ = auVar24._8_4_ + auVar18._8_4_;
      auVar131._12_4_ = auVar24._12_4_ + auVar18._12_4_;
      auVar131._16_4_ = auVar24._16_4_ + auVar18._16_4_;
      auVar131._20_4_ = auVar24._20_4_ + auVar18._20_4_;
      auVar131._24_4_ = auVar24._24_4_ + auVar18._24_4_;
      fVar263 = auVar18._28_4_;
      auVar131._28_4_ = auVar24._28_4_ + fVar263;
      auVar45._4_4_ = fVar147 * fVar240;
      auVar45._0_4_ = fVar104 * fVar239;
      auVar45._8_4_ = fVar69 * fVar241;
      auVar45._12_4_ = fVar146 * fVar242;
      auVar45._16_4_ = fVar243 * 0.0;
      auVar45._20_4_ = fVar244 * 0.0;
      auVar45._24_4_ = fVar105 * 0.0;
      auVar45._28_4_ = auVar28._28_4_;
      auVar71 = vfnmadd231ps_fma(auVar45,auVar131,local_1e0);
      auVar46._4_4_ = fVar240 * fStack_29c;
      auVar46._0_4_ = fVar239 * local_2a0;
      auVar46._8_4_ = fVar241 * fStack_298;
      auVar46._12_4_ = fVar242 * fStack_294;
      auVar46._16_4_ = fVar243 * fStack_290;
      auVar46._20_4_ = fVar244 * fStack_28c;
      auVar46._24_4_ = fVar105 * fStack_288;
      auVar46._28_4_ = 0;
      auVar16 = vfnmadd213ps_fma(auVar130,auVar131,auVar46);
      auVar47._4_4_ = fVar240 * local_2c0._4_4_;
      auVar47._0_4_ = fVar239 * local_2c0._0_4_;
      auVar47._8_4_ = fVar241 * local_2c0._8_4_;
      auVar47._12_4_ = fVar242 * local_2c0._12_4_;
      auVar47._16_4_ = fVar243 * local_2c0._16_4_;
      auVar47._20_4_ = fVar244 * local_2c0._20_4_;
      auVar47._24_4_ = fVar105 * local_2c0._24_4_;
      auVar47._28_4_ = 0;
      auVar17 = vfnmadd213ps_fma(local_200,auVar131,auVar47);
      auVar48._4_4_ = (float)local_760._4_4_ * fVar240;
      auVar48._0_4_ = (float)local_760._0_4_ * fVar239;
      auVar48._8_4_ = (float)uStack_758 * fVar241;
      auVar48._12_4_ = uStack_758._4_4_ * fVar242;
      auVar48._16_4_ = (float)uStack_750 * fVar243;
      auVar48._20_4_ = uStack_750._4_4_ * fVar244;
      auVar48._24_4_ = (float)uStack_748 * fVar105;
      auVar48._28_4_ = 0;
      auVar301 = vfnmadd231ps_fma(auVar48,auVar131,auVar26);
      auVar165._0_4_ = fVar145 * fVar239;
      auVar165._4_4_ = fVar167 * fVar240;
      auVar165._8_4_ = fVar168 * fVar241;
      auVar165._12_4_ = fVar169 * fVar242;
      auVar165._16_4_ = fVar243 * 0.0;
      auVar165._20_4_ = fVar244 * 0.0;
      auVar165._24_4_ = fVar105 * 0.0;
      auVar165._28_4_ = 0;
      auVar107 = vfnmadd231ps_fma(auVar165,auVar131,auVar309);
      auVar49._4_4_ = fVar240 * fStack_27c;
      auVar49._0_4_ = fVar239 * local_280;
      auVar49._8_4_ = fVar241 * fStack_278;
      auVar49._12_4_ = fVar242 * fStack_274;
      auVar49._16_4_ = fVar243 * fStack_270;
      auVar49._20_4_ = fVar244 * fStack_26c;
      auVar49._24_4_ = fVar105 * fStack_268;
      auVar49._28_4_ = fVar263;
      auVar160 = vfnmadd213ps_fma(local_240,auVar131,auVar49);
      auVar50._4_4_ = fVar240 * local_260._4_4_;
      auVar50._0_4_ = fVar239 * local_260._0_4_;
      auVar50._8_4_ = fVar241 * local_260._8_4_;
      auVar50._12_4_ = fVar242 * local_260._12_4_;
      auVar50._16_4_ = fVar243 * local_260._16_4_;
      auVar50._20_4_ = fVar244 * local_260._20_4_;
      auVar50._24_4_ = fVar105 * local_260._24_4_;
      auVar50._28_4_ = fVar263;
      auVar73 = vfnmadd213ps_fma(auVar30,auVar131,auVar50);
      auVar51._4_4_ = fVar240 * auVar29._4_4_;
      auVar51._0_4_ = fVar239 * auVar29._0_4_;
      auVar51._8_4_ = fVar241 * auVar29._8_4_;
      auVar51._12_4_ = fVar242 * auVar29._12_4_;
      auVar51._16_4_ = fVar243 * auVar29._16_4_;
      auVar51._20_4_ = fVar244 * auVar29._20_4_;
      auVar51._24_4_ = fVar105 * auVar29._24_4_;
      auVar51._28_4_ = auVar25._28_4_ + auVar99._28_4_;
      auVar133 = vfnmadd231ps_fma(auVar51,auVar131,auVar28);
      auVar99 = vminps_avx(ZEXT1632(auVar71),ZEXT1632(auVar16));
      auVar25 = vmaxps_avx(ZEXT1632(auVar71),ZEXT1632(auVar16));
      auVar24 = vminps_avx(ZEXT1632(auVar17),ZEXT1632(auVar301));
      auVar24 = vminps_avx(auVar99,auVar24);
      auVar99 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar301));
      auVar25 = vmaxps_avx(auVar25,auVar99);
      auVar18 = vminps_avx(ZEXT1632(auVar107),ZEXT1632(auVar160));
      auVar99 = vmaxps_avx(ZEXT1632(auVar107),ZEXT1632(auVar160));
      auVar26 = vminps_avx(ZEXT1632(auVar73),ZEXT1632(auVar133));
      auVar18 = vminps_avx(auVar18,auVar26);
      auVar18 = vminps_avx(auVar24,auVar18);
      auVar24 = vmaxps_avx(ZEXT1632(auVar73),ZEXT1632(auVar133));
      auVar99 = vmaxps_avx(auVar99,auVar24);
      auVar99 = vmaxps_avx(auVar25,auVar99);
      auVar54._4_4_ = fStack_37c;
      auVar54._0_4_ = local_380;
      auVar54._8_4_ = fStack_378;
      auVar54._12_4_ = fStack_374;
      auVar54._16_4_ = fStack_370;
      auVar54._20_4_ = fStack_36c;
      auVar54._24_4_ = fStack_368;
      auVar54._28_4_ = fStack_364;
      auVar25 = vcmpps_avx(auVar18,auVar54,2);
      auVar99 = vcmpps_avx(auVar99,auVar55,5);
      auVar25 = vandps_avx(auVar99,auVar25);
      auVar98 = vandps_avx(auVar98,local_2e0);
      auVar99 = auVar98 & auVar25;
      if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar99 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar99 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar99 >> 0x7f,0) != '\0') ||
            (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar99 >> 0xbf,0) != '\0') ||
          (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar99[0x1f] < '\0') {
        auVar98 = vandps_avx(auVar25,auVar98);
        uVar65 = vmovmskps_avx(auVar98);
        if (uVar65 != 0) {
          uVar61 = (ulong)uVar67;
          auStack_4b0[uVar61] = uVar65 & 0xff;
          uVar106 = vmovlps_avx(local_420);
          *(undefined8 *)(&uStack_360 + uVar61 * 2) = uVar106;
          uVar60 = vmovlps_avx(auVar190);
          auStack_1a0[uVar61] = uVar60;
          uVar67 = uVar67 + 1;
        }
      }
    }
    if (uVar67 != 0) {
      do {
        uVar61 = (ulong)(uVar67 - 1);
        uVar64 = auStack_4b0[uVar61];
        uVar65 = (&uStack_360)[uVar61 * 2];
        fVar104 = afStack_35c[uVar61 * 2];
        iVar58 = 0;
        for (uVar60 = (ulong)uVar64; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
          iVar58 = iVar58 + 1;
        }
        uVar64 = uVar64 - 1 & uVar64;
        if (uVar64 == 0) {
          uVar67 = uVar67 - 1;
        }
        auVar191._8_8_ = 0;
        auVar191._0_8_ = auStack_1a0[uVar61];
        auVar201 = ZEXT1664(auVar191);
        auStack_4b0[uVar61] = uVar64;
        fVar147 = (float)(iVar58 + 1) * 0.14285715;
        auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar104 * (float)iVar58 * 0.14285715)),
                                  ZEXT416(uVar65),ZEXT416((uint)(1.0 - (float)iVar58 * 0.14285715)))
        ;
        auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar104 * fVar147)),ZEXT416(uVar65),
                                  ZEXT416((uint)(1.0 - fVar147)));
        fVar147 = auVar17._0_4_;
        fVar69 = auVar16._0_4_;
        fVar104 = fVar147 - fVar69;
        if (0.16666667 <= fVar104) {
          auVar16 = vinsertps_avx(auVar16,auVar17,0x10);
          auVar297 = ZEXT1664(auVar16);
          goto LAB_017391f9;
        }
        auVar160 = vshufps_avx(auVar191,auVar191,0x50);
        auVar119._8_4_ = 0x3f800000;
        auVar119._0_8_ = 0x3f8000003f800000;
        auVar119._12_4_ = 0x3f800000;
        auVar73 = vsubps_avx(auVar119,auVar160);
        fVar146 = auVar160._0_4_;
        auVar178._0_4_ = fVar146 * fVar245;
        fVar145 = auVar160._4_4_;
        auVar178._4_4_ = fVar145 * fVar261;
        fVar167 = auVar160._8_4_;
        auVar178._8_4_ = fVar167 * fVar245;
        fVar168 = auVar160._12_4_;
        auVar178._12_4_ = fVar168 * fVar261;
        auVar192._0_4_ = fVar262 * fVar146;
        auVar192._4_4_ = fVar221 * fVar145;
        auVar192._8_4_ = fVar262 * fVar167;
        auVar192._12_4_ = fVar221 * fVar168;
        auVar216._0_4_ = fVar222 * fVar146;
        auVar216._4_4_ = fVar238 * fVar145;
        auVar216._8_4_ = fVar222 * fVar167;
        auVar216._12_4_ = fVar238 * fVar168;
        auVar87._0_4_ = fVar264 * fVar146;
        auVar87._4_4_ = fVar277 * fVar145;
        auVar87._8_4_ = fVar264 * fVar167;
        auVar87._12_4_ = fVar277 * fVar168;
        auVar160 = vfmadd231ps_fma(auVar178,auVar73,auVar253);
        auVar71 = vfmadd231ps_fma(auVar192,auVar73,auVar282);
        auVar301 = vfmadd231ps_fma(auVar216,auVar73,auVar313);
        auVar73 = vfmadd231ps_fma(auVar87,auVar73,auVar324);
        auVar166._16_16_ = auVar160;
        auVar166._0_16_ = auVar160;
        auVar182._16_16_ = auVar71;
        auVar182._0_16_ = auVar71;
        auVar200._16_16_ = auVar301;
        auVar200._0_16_ = auVar301;
        auVar237._4_4_ = fVar69;
        auVar237._0_4_ = fVar69;
        auVar237._8_4_ = fVar69;
        auVar237._12_4_ = fVar69;
        auVar237._20_4_ = fVar147;
        auVar237._16_4_ = fVar147;
        auVar237._24_4_ = fVar147;
        auVar237._28_4_ = fVar147;
        auVar98 = vsubps_avx(auVar182,auVar166);
        auVar71 = vfmadd213ps_fma(auVar98,auVar237,auVar166);
        auVar98 = vsubps_avx(auVar200,auVar182);
        auVar107 = vfmadd213ps_fma(auVar98,auVar237,auVar182);
        auVar160 = vsubps_avx(auVar73,auVar301);
        auVar101._16_16_ = auVar160;
        auVar101._0_16_ = auVar160;
        auVar160 = vfmadd213ps_fma(auVar101,auVar237,auVar200);
        auVar98 = vsubps_avx(ZEXT1632(auVar107),ZEXT1632(auVar71));
        auVar73 = vfmadd213ps_fma(auVar98,auVar237,ZEXT1632(auVar71));
        auVar98 = vsubps_avx(ZEXT1632(auVar160),ZEXT1632(auVar107));
        auVar160 = vfmadd213ps_fma(auVar98,auVar237,ZEXT1632(auVar107));
        auVar98 = vsubps_avx(ZEXT1632(auVar160),ZEXT1632(auVar73));
        auVar134 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar98,auVar237);
        fVar146 = fVar104 * 0.33333334;
        auVar231._0_8_ =
             CONCAT44(auVar134._4_4_ + fVar146 * auVar98._4_4_ * 3.0,
                      auVar134._0_4_ + fVar146 * auVar98._0_4_ * 3.0);
        auVar231._8_4_ = auVar134._8_4_ + fVar146 * auVar98._8_4_ * 3.0;
        auVar231._12_4_ = auVar134._12_4_ + fVar146 * auVar98._12_4_ * 3.0;
        auVar73 = vshufpd_avx(auVar134,auVar134,3);
        auVar71 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar160 = vsubps_avx(auVar73,auVar134);
        auVar301 = vsubps_avx(auVar71,(undefined1  [16])0x0);
        auVar88._0_4_ = auVar160._0_4_ + auVar301._0_4_;
        auVar88._4_4_ = auVar160._4_4_ + auVar301._4_4_;
        auVar88._8_4_ = auVar160._8_4_ + auVar301._8_4_;
        auVar88._12_4_ = auVar160._12_4_ + auVar301._12_4_;
        auVar160 = vshufps_avx(auVar134,auVar134,0xb1);
        auVar301 = vshufps_avx(auVar231,auVar231,0xb1);
        auVar325._4_4_ = auVar88._0_4_;
        auVar325._0_4_ = auVar88._0_4_;
        auVar325._8_4_ = auVar88._0_4_;
        auVar325._12_4_ = auVar88._0_4_;
        auVar107 = vshufps_avx(auVar88,auVar88,0x55);
        fVar145 = auVar107._0_4_;
        auVar89._0_4_ = fVar145 * auVar160._0_4_;
        fVar167 = auVar107._4_4_;
        auVar89._4_4_ = fVar167 * auVar160._4_4_;
        fVar168 = auVar107._8_4_;
        auVar89._8_4_ = fVar168 * auVar160._8_4_;
        fVar169 = auVar107._12_4_;
        auVar89._12_4_ = fVar169 * auVar160._12_4_;
        auVar193._0_4_ = fVar145 * auVar301._0_4_;
        auVar193._4_4_ = fVar167 * auVar301._4_4_;
        auVar193._8_4_ = fVar168 * auVar301._8_4_;
        auVar193._12_4_ = fVar169 * auVar301._12_4_;
        auVar133 = vfmadd231ps_fma(auVar89,auVar325,auVar134);
        auVar293 = vfmadd231ps_fma(auVar193,auVar325,auVar231);
        auVar301 = vshufps_avx(auVar133,auVar133,0xe8);
        auVar107 = vshufps_avx(auVar293,auVar293,0xe8);
        auVar160 = vcmpps_avx(auVar301,auVar107,1);
        uVar65 = vextractps_avx(auVar160,0);
        auVar170 = auVar293;
        if ((uVar65 & 1) == 0) {
          auVar170 = auVar133;
        }
        auVar156._0_4_ = fVar146 * auVar98._16_4_ * 3.0;
        auVar156._4_4_ = fVar146 * auVar98._20_4_ * 3.0;
        auVar156._8_4_ = fVar146 * auVar98._24_4_ * 3.0;
        auVar156._12_4_ = fVar146 * 0.0;
        auVar223 = vsubps_avx((undefined1  [16])0x0,auVar156);
        auVar157 = vshufps_avx(auVar223,auVar223,0xb1);
        auVar202 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar232._0_4_ = fVar145 * auVar157._0_4_;
        auVar232._4_4_ = fVar167 * auVar157._4_4_;
        auVar232._8_4_ = fVar168 * auVar157._8_4_;
        auVar232._12_4_ = fVar169 * auVar157._12_4_;
        auVar254._0_4_ = auVar202._0_4_ * fVar145;
        auVar254._4_4_ = auVar202._4_4_ * fVar167;
        auVar254._8_4_ = auVar202._8_4_ * fVar168;
        auVar254._12_4_ = auVar202._12_4_ * fVar169;
        auVar224 = vfmadd231ps_fma(auVar232,auVar325,auVar223);
        auVar246 = vfmadd231ps_fma(auVar254,(undefined1  [16])0x0,auVar325);
        auVar202 = vshufps_avx(auVar224,auVar224,0xe8);
        auVar190 = vshufps_avx(auVar246,auVar246,0xe8);
        auVar157 = vcmpps_avx(auVar202,auVar190,1);
        uVar65 = vextractps_avx(auVar157,0);
        auVar247 = auVar246;
        if ((uVar65 & 1) == 0) {
          auVar247 = auVar224;
        }
        auVar170 = vmaxss_avx(auVar247,auVar170);
        auVar301 = vminps_avx(auVar301,auVar107);
        auVar107 = vminps_avx(auVar202,auVar190);
        auVar107 = vminps_avx(auVar301,auVar107);
        auVar160 = vshufps_avx(auVar160,auVar160,0x55);
        auVar160 = vblendps_avx(auVar160,auVar157,2);
        auVar157 = vpslld_avx(auVar160,0x1f);
        auVar160 = vshufpd_avx(auVar293,auVar293,1);
        auVar160 = vinsertps_avx(auVar160,auVar246,0x9c);
        auVar301 = vshufpd_avx(auVar133,auVar133,1);
        auVar301 = vinsertps_avx(auVar301,auVar224,0x9c);
        auVar160 = vblendvps_avx(auVar301,auVar160,auVar157);
        auVar301 = vmovshdup_avx(auVar160);
        auVar160 = vmaxss_avx(auVar301,auVar160);
        fVar168 = auVar107._0_4_;
        auVar301 = vmovshdup_avx(auVar107);
        fVar167 = auVar160._0_4_;
        fVar146 = auVar301._0_4_;
        fVar145 = auVar170._0_4_;
        if (((fVar168 < 0.0001) && (-0.0001 < fVar167)) || (fVar146 < 0.0001 && -0.0001 < fVar167))
        {
LAB_01739abd:
          auVar133 = vcmpps_avx(auVar107,_DAT_01f7aa10,1);
          auVar293 = SUB6416(ZEXT864(0),0) << 0x20;
          auVar301 = vcmpss_avx(auVar170,ZEXT816(0) << 0x20,1);
          auVar120._8_4_ = 0x3f800000;
          auVar120._0_8_ = 0x3f8000003f800000;
          auVar120._12_4_ = 0x3f800000;
          auVar139._8_4_ = 0xbf800000;
          auVar139._0_8_ = 0xbf800000bf800000;
          auVar139._12_4_ = 0xbf800000;
          auVar301 = vblendvps_avx(auVar120,auVar139,auVar301);
          auVar133 = vblendvps_avx(auVar120,auVar139,auVar133);
          fVar263 = auVar133._0_4_;
          fVar169 = auVar301._0_4_;
          auVar301 = SUB6416(ZEXT864(0),0) << 0x20;
          if ((fVar263 == fVar169) && (!NAN(fVar263) && !NAN(fVar169))) {
            auVar301 = SUB6416(ZEXT464(0x7f800000),0);
          }
          if ((fVar263 == fVar169) && (!NAN(fVar263) && !NAN(fVar169))) {
            auVar293 = SUB6416(ZEXT464(0xff800000),0);
          }
          auVar133 = vmovshdup_avx(auVar133);
          fVar239 = auVar133._0_4_;
          if ((fVar263 != fVar239) || (NAN(fVar263) || NAN(fVar239))) {
            if ((fVar146 != fVar168) || (NAN(fVar146) || NAN(fVar168))) {
              auVar158._0_8_ = auVar107._0_8_ ^ 0x8000000080000000;
              auVar158._8_4_ = auVar107._8_4_ ^ 0x80000000;
              auVar158._12_4_ = auVar107._12_4_ ^ 0x80000000;
              auVar159._0_4_ = -fVar168 / (fVar146 - fVar168);
              auVar159._4_12_ = auVar158._4_12_;
              auVar107 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar159._0_4_)),auVar159,ZEXT416(0));
              auVar133 = auVar107;
            }
            else {
              auVar107 = ZEXT816(0) << 0x20;
              if ((fVar168 != 0.0) || (auVar133 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar168))) {
                auVar107 = SUB6416(ZEXT464(0x7f800000),0);
                auVar133 = SUB6416(ZEXT464(0xff800000),0);
              }
            }
            auVar301 = vminss_avx(auVar301,auVar107);
            auVar293 = vmaxss_avx(auVar133,auVar293);
          }
          auVar160 = vcmpss_avx(auVar160,ZEXT416(0),1);
          auVar121._8_4_ = 0x3f800000;
          auVar121._0_8_ = 0x3f8000003f800000;
          auVar121._12_4_ = 0x3f800000;
          auVar140._8_4_ = 0xbf800000;
          auVar140._0_8_ = 0xbf800000bf800000;
          auVar140._12_4_ = 0xbf800000;
          auVar160 = vblendvps_avx(auVar121,auVar140,auVar160);
          fVar146 = auVar160._0_4_;
          if ((fVar169 != fVar146) || (NAN(fVar169) || NAN(fVar146))) {
            if ((fVar167 != fVar145) || (NAN(fVar167) || NAN(fVar145))) {
              auVar90._0_8_ = auVar170._0_8_ ^ 0x8000000080000000;
              auVar90._8_4_ = auVar170._8_4_ ^ 0x80000000;
              auVar90._12_4_ = auVar170._12_4_ ^ 0x80000000;
              auVar161._0_4_ = -fVar145 / (fVar167 - fVar145);
              auVar161._4_12_ = auVar90._4_12_;
              auVar160 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar161._0_4_)),auVar161,ZEXT416(0));
              auVar107 = auVar160;
            }
            else {
              auVar160 = SUB6416(ZEXT464(0x3f800000),0);
              if ((fVar145 != 0.0) || (auVar107 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar145))) {
                auVar160 = SUB6416(ZEXT464(0xff800000),0);
                auVar107 = SUB6416(ZEXT464(0x7f800000),0);
              }
            }
            auVar301 = vminss_avx(auVar301,auVar107);
            auVar293 = vmaxss_avx(auVar160,auVar293);
          }
          if ((fVar239 != fVar146) || (NAN(fVar239) || NAN(fVar146))) {
            auVar301 = vminss_avx(auVar301,SUB6416(ZEXT464(0x3f800000),0));
            auVar293 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar293);
          }
          auVar160 = vmaxss_avx(ZEXT816(0) << 0x40,auVar301);
          auVar301 = vminss_avx(auVar293,SUB6416(ZEXT464(0x3f800000),0));
          if (auVar160._0_4_ <= auVar301._0_4_) {
            auVar160 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar160._0_4_ + -0.1)));
            auVar301 = vminss_avx(ZEXT416((uint)(auVar301._0_4_ + 0.1)),
                                  SUB6416(ZEXT464(0x3f800000),0));
            auVar179._0_8_ = auVar134._0_8_;
            auVar179._8_8_ = auVar179._0_8_;
            auVar269._8_8_ = auVar231._0_8_;
            auVar269._0_8_ = auVar231._0_8_;
            auVar283._8_8_ = auVar223._0_8_;
            auVar283._0_8_ = auVar223._0_8_;
            auVar107 = vshufpd_avx(auVar231,auVar231,3);
            auVar133 = vshufpd_avx(auVar223,auVar223,3);
            auVar293 = vshufps_avx(auVar160,auVar301,0);
            auVar91._8_4_ = 0x3f800000;
            auVar91._0_8_ = 0x3f8000003f800000;
            auVar91._12_4_ = 0x3f800000;
            auVar134 = vsubps_avx(auVar91,auVar293);
            local_560 = auVar73._0_4_;
            fStack_55c = auVar73._4_4_;
            fStack_558 = auVar73._8_4_;
            fStack_554 = auVar73._12_4_;
            fVar146 = auVar293._0_4_;
            auVar92._0_4_ = fVar146 * local_560;
            fVar145 = auVar293._4_4_;
            auVar92._4_4_ = fVar145 * fStack_55c;
            fVar167 = auVar293._8_4_;
            auVar92._8_4_ = fVar167 * fStack_558;
            fVar168 = auVar293._12_4_;
            auVar92._12_4_ = fVar168 * fStack_554;
            auVar217._0_4_ = fVar146 * auVar107._0_4_;
            auVar217._4_4_ = fVar145 * auVar107._4_4_;
            auVar217._8_4_ = fVar167 * auVar107._8_4_;
            auVar217._12_4_ = fVar168 * auVar107._12_4_;
            auVar233._0_4_ = fVar146 * auVar133._0_4_;
            auVar233._4_4_ = fVar145 * auVar133._4_4_;
            auVar233._8_4_ = fVar167 * auVar133._8_4_;
            auVar233._12_4_ = fVar168 * auVar133._12_4_;
            local_640 = auVar71._0_4_;
            fStack_63c = auVar71._4_4_;
            fStack_638 = auVar71._8_4_;
            fStack_634 = auVar71._12_4_;
            auVar255._0_4_ = fVar146 * local_640;
            auVar255._4_4_ = fVar145 * fStack_63c;
            auVar255._8_4_ = fVar167 * fStack_638;
            auVar255._12_4_ = fVar168 * fStack_634;
            auVar107 = vfmadd231ps_fma(auVar92,auVar134,auVar179);
            auVar133 = vfmadd231ps_fma(auVar217,auVar134,auVar269);
            auVar293 = vfmadd231ps_fma(auVar233,auVar134,auVar283);
            auVar134 = vfmadd231ps_fma(auVar255,auVar134,ZEXT816(0));
            auVar73 = vmovshdup_avx(auVar191);
            auVar223 = vfmadd231ss_fma(ZEXT416((uint)(auVar73._0_4_ * auVar160._0_4_)),auVar191,
                                       ZEXT416((uint)(1.0 - auVar160._0_4_)));
            auVar224 = vfmadd231ss_fma(ZEXT416((uint)(auVar73._0_4_ * auVar301._0_4_)),auVar191,
                                       ZEXT416((uint)(1.0 - auVar301._0_4_)));
            fVar146 = 1.0 / fVar104;
            auVar160 = vsubps_avx(auVar133,auVar107);
            auVar270._0_4_ = auVar160._0_4_ * 3.0;
            auVar270._4_4_ = auVar160._4_4_ * 3.0;
            auVar270._8_4_ = auVar160._8_4_ * 3.0;
            auVar270._12_4_ = auVar160._12_4_ * 3.0;
            auVar160 = vsubps_avx(auVar293,auVar133);
            auVar284._0_4_ = auVar160._0_4_ * 3.0;
            auVar284._4_4_ = auVar160._4_4_ * 3.0;
            auVar284._8_4_ = auVar160._8_4_ * 3.0;
            auVar284._12_4_ = auVar160._12_4_ * 3.0;
            auVar160 = vsubps_avx(auVar134,auVar293);
            auVar294._0_4_ = auVar160._0_4_ * 3.0;
            auVar294._4_4_ = auVar160._4_4_ * 3.0;
            auVar294._8_4_ = auVar160._8_4_ * 3.0;
            auVar294._12_4_ = auVar160._12_4_ * 3.0;
            auVar73 = vminps_avx(auVar284,auVar294);
            auVar160 = vmaxps_avx(auVar284,auVar294);
            auVar73 = vminps_avx(auVar270,auVar73);
            auVar160 = vmaxps_avx(auVar270,auVar160);
            auVar71 = vshufpd_avx(auVar73,auVar73,3);
            auVar301 = vshufpd_avx(auVar160,auVar160,3);
            auVar73 = vminps_avx(auVar73,auVar71);
            auVar160 = vmaxps_avx(auVar160,auVar301);
            auVar285._0_4_ = auVar73._0_4_ * fVar146;
            auVar285._4_4_ = auVar73._4_4_ * fVar146;
            auVar285._8_4_ = auVar73._8_4_ * fVar146;
            auVar285._12_4_ = auVar73._12_4_ * fVar146;
            auVar271._0_4_ = auVar160._0_4_ * fVar146;
            auVar271._4_4_ = auVar160._4_4_ * fVar146;
            auVar271._8_4_ = auVar160._8_4_ * fVar146;
            auVar271._12_4_ = auVar160._12_4_ * fVar146;
            fVar146 = 1.0 / (auVar224._0_4_ - auVar223._0_4_);
            auVar160 = vshufpd_avx(auVar107,auVar107,3);
            auVar73 = vshufpd_avx(auVar133,auVar133,3);
            auVar71 = vshufpd_avx(auVar293,auVar293,3);
            auVar301 = vshufpd_avx(auVar134,auVar134,3);
            auVar160 = vsubps_avx(auVar160,auVar107);
            auVar107 = vsubps_avx(auVar73,auVar133);
            auVar133 = vsubps_avx(auVar71,auVar293);
            auVar301 = vsubps_avx(auVar301,auVar134);
            auVar73 = vminps_avx(auVar160,auVar107);
            auVar160 = vmaxps_avx(auVar160,auVar107);
            auVar71 = vminps_avx(auVar133,auVar301);
            auVar71 = vminps_avx(auVar73,auVar71);
            auVar73 = vmaxps_avx(auVar133,auVar301);
            auVar160 = vmaxps_avx(auVar160,auVar73);
            auVar314._0_4_ = fVar146 * auVar71._0_4_;
            auVar314._4_4_ = fVar146 * auVar71._4_4_;
            auVar314._8_4_ = fVar146 * auVar71._8_4_;
            auVar314._12_4_ = fVar146 * auVar71._12_4_;
            auVar302._0_4_ = fVar146 * auVar160._0_4_;
            auVar302._4_4_ = fVar146 * auVar160._4_4_;
            auVar302._8_4_ = fVar146 * auVar160._8_4_;
            auVar302._12_4_ = fVar146 * auVar160._12_4_;
            auVar301 = vinsertps_avx(auVar16,auVar223,0x10);
            auVar107 = vinsertps_avx(auVar17,auVar224,0x10);
            auVar295._0_4_ = (auVar301._0_4_ + auVar107._0_4_) * 0.5;
            auVar295._4_4_ = (auVar301._4_4_ + auVar107._4_4_) * 0.5;
            auVar295._8_4_ = (auVar301._8_4_ + auVar107._8_4_) * 0.5;
            auVar295._12_4_ = (auVar301._12_4_ + auVar107._12_4_) * 0.5;
            auVar93._4_4_ = auVar295._0_4_;
            auVar93._0_4_ = auVar295._0_4_;
            auVar93._8_4_ = auVar295._0_4_;
            auVar93._12_4_ = auVar295._0_4_;
            auVar160 = vfmadd213ps_fma(local_390,auVar93,auVar19);
            auVar73 = vfmadd213ps_fma(local_3a0,auVar93,auVar20);
            auVar71 = vfmadd213ps_fma(local_3b0,auVar93,auVar188);
            auVar17 = vsubps_avx(auVar73,auVar160);
            auVar160 = vfmadd213ps_fma(auVar17,auVar93,auVar160);
            auVar17 = vsubps_avx(auVar71,auVar73);
            auVar17 = vfmadd213ps_fma(auVar17,auVar93,auVar73);
            auVar17 = vsubps_avx(auVar17,auVar160);
            auVar160 = vfmadd231ps_fma(auVar160,auVar17,auVar93);
            auVar94._0_8_ = CONCAT44(auVar17._4_4_ * 3.0,auVar17._0_4_ * 3.0);
            auVar94._8_4_ = auVar17._8_4_ * 3.0;
            auVar94._12_4_ = auVar17._12_4_ * 3.0;
            auVar326._8_8_ = auVar160._0_8_;
            auVar326._0_8_ = auVar160._0_8_;
            auVar17 = vshufpd_avx(auVar160,auVar160,3);
            auVar160 = vshufps_avx(auVar295,auVar295,0x55);
            auVar293 = vsubps_avx(auVar17,auVar326);
            auVar170 = vfmadd231ps_fma(auVar326,auVar160,auVar293);
            auVar334._8_8_ = auVar94._0_8_;
            auVar334._0_8_ = auVar94._0_8_;
            auVar17 = vshufpd_avx(auVar94,auVar94,3);
            auVar17 = vsubps_avx(auVar17,auVar334);
            auVar134 = vfmadd213ps_fma(auVar17,auVar160,auVar334);
            auVar160 = vmovshdup_avx(auVar134);
            auVar335._0_8_ = auVar160._0_8_ ^ 0x8000000080000000;
            auVar335._8_4_ = auVar160._8_4_ ^ 0x80000000;
            auVar335._12_4_ = auVar160._12_4_ ^ 0x80000000;
            auVar73 = vmovshdup_avx(auVar293);
            auVar17 = vunpcklps_avx(auVar73,auVar335);
            auVar71 = vshufps_avx(auVar17,auVar335,4);
            auVar133 = vshufps_avx(auVar295,auVar295,0x54);
            auVar162._0_8_ = auVar293._0_8_ ^ 0x8000000080000000;
            auVar162._8_4_ = auVar293._8_4_ ^ 0x80000000;
            auVar162._12_4_ = auVar293._12_4_ ^ 0x80000000;
            auVar17 = vmovlhps_avx(auVar162,auVar134);
            auVar17 = vshufps_avx(auVar17,auVar134,8);
            auVar160 = vfmsub231ss_fma(ZEXT416((uint)(auVar293._0_4_ * auVar160._0_4_)),auVar73,
                                       auVar134);
            uVar70 = auVar160._0_4_;
            auVar95._4_4_ = uVar70;
            auVar95._0_4_ = uVar70;
            auVar95._8_4_ = uVar70;
            auVar95._12_4_ = uVar70;
            auVar160 = vdivps_avx(auVar71,auVar95);
            auVar73 = vdivps_avx(auVar17,auVar95);
            fVar167 = auVar170._0_4_;
            fVar146 = auVar160._0_4_;
            auVar17 = vshufps_avx(auVar170,auVar170,0x55);
            fVar145 = auVar73._0_4_;
            auVar96._0_4_ = fVar167 * fVar146 + auVar17._0_4_ * fVar145;
            auVar96._4_4_ = fVar167 * auVar160._4_4_ + auVar17._4_4_ * auVar73._4_4_;
            auVar96._8_4_ = fVar167 * auVar160._8_4_ + auVar17._8_4_ * auVar73._8_4_;
            auVar96._12_4_ = fVar167 * auVar160._12_4_ + auVar17._12_4_ * auVar73._12_4_;
            auVar190 = vsubps_avx(auVar133,auVar96);
            auVar133 = vmovshdup_avx(auVar160);
            auVar17 = vinsertps_avx(auVar285,auVar314,0x1c);
            auVar194._0_4_ = auVar133._0_4_ * auVar17._0_4_;
            auVar194._4_4_ = auVar133._4_4_ * auVar17._4_4_;
            auVar194._8_4_ = auVar133._8_4_ * auVar17._8_4_;
            auVar194._12_4_ = auVar133._12_4_ * auVar17._12_4_;
            auVar71 = vinsertps_avx(auVar271,auVar302,0x1c);
            auVar122._0_4_ = auVar71._0_4_ * auVar133._0_4_;
            auVar122._4_4_ = auVar71._4_4_ * auVar133._4_4_;
            auVar122._8_4_ = auVar71._8_4_ * auVar133._8_4_;
            auVar122._12_4_ = auVar71._12_4_ * auVar133._12_4_;
            auVar170 = vminps_avx(auVar194,auVar122);
            auVar134 = vmaxps_avx(auVar122,auVar194);
            auVar133 = vinsertps_avx(auVar314,auVar285,0x4c);
            auVar157 = vmovshdup_avx(auVar73);
            auVar293 = vinsertps_avx(auVar302,auVar271,0x4c);
            auVar303._0_4_ = auVar157._0_4_ * auVar133._0_4_;
            auVar303._4_4_ = auVar157._4_4_ * auVar133._4_4_;
            auVar303._8_4_ = auVar157._8_4_ * auVar133._8_4_;
            auVar303._12_4_ = auVar157._12_4_ * auVar133._12_4_;
            auVar286._0_4_ = auVar157._0_4_ * auVar293._0_4_;
            auVar286._4_4_ = auVar157._4_4_ * auVar293._4_4_;
            auVar286._8_4_ = auVar157._8_4_ * auVar293._8_4_;
            auVar286._12_4_ = auVar157._12_4_ * auVar293._12_4_;
            auVar157 = vminps_avx(auVar303,auVar286);
            auVar315._0_4_ = auVar170._0_4_ + auVar157._0_4_;
            auVar315._4_4_ = auVar170._4_4_ + auVar157._4_4_;
            auVar315._8_4_ = auVar170._8_4_ + auVar157._8_4_;
            auVar315._12_4_ = auVar170._12_4_ + auVar157._12_4_;
            auVar170 = vmaxps_avx(auVar286,auVar303);
            auVar123._0_4_ = auVar170._0_4_ + auVar134._0_4_;
            auVar123._4_4_ = auVar170._4_4_ + auVar134._4_4_;
            auVar123._8_4_ = auVar170._8_4_ + auVar134._8_4_;
            auVar123._12_4_ = auVar170._12_4_ + auVar134._12_4_;
            auVar287._8_8_ = 0x3f80000000000000;
            auVar287._0_8_ = 0x3f80000000000000;
            auVar134 = vsubps_avx(auVar287,auVar123);
            auVar170 = vsubps_avx(auVar287,auVar315);
            auVar157 = vsubps_avx(auVar301,auVar295);
            auVar202 = vsubps_avx(auVar107,auVar295);
            auVar141._0_4_ = fVar146 * auVar17._0_4_;
            auVar141._4_4_ = fVar146 * auVar17._4_4_;
            auVar141._8_4_ = fVar146 * auVar17._8_4_;
            auVar141._12_4_ = fVar146 * auVar17._12_4_;
            auVar316._0_4_ = fVar146 * auVar71._0_4_;
            auVar316._4_4_ = fVar146 * auVar71._4_4_;
            auVar316._8_4_ = fVar146 * auVar71._8_4_;
            auVar316._12_4_ = fVar146 * auVar71._12_4_;
            auVar71 = vminps_avx(auVar141,auVar316);
            auVar17 = vmaxps_avx(auVar316,auVar141);
            auVar195._0_4_ = fVar145 * auVar133._0_4_;
            auVar195._4_4_ = fVar145 * auVar133._4_4_;
            auVar195._8_4_ = fVar145 * auVar133._8_4_;
            auVar195._12_4_ = fVar145 * auVar133._12_4_;
            auVar272._0_4_ = fVar145 * auVar293._0_4_;
            auVar272._4_4_ = fVar145 * auVar293._4_4_;
            auVar272._8_4_ = fVar145 * auVar293._8_4_;
            auVar272._12_4_ = fVar145 * auVar293._12_4_;
            auVar133 = vminps_avx(auVar195,auVar272);
            auVar317._0_4_ = auVar71._0_4_ + auVar133._0_4_;
            auVar317._4_4_ = auVar71._4_4_ + auVar133._4_4_;
            auVar317._8_4_ = auVar71._8_4_ + auVar133._8_4_;
            auVar317._12_4_ = auVar71._12_4_ + auVar133._12_4_;
            fVar239 = auVar157._0_4_;
            auVar327._0_4_ = fVar239 * auVar134._0_4_;
            fVar240 = auVar157._4_4_;
            auVar327._4_4_ = fVar240 * auVar134._4_4_;
            fVar241 = auVar157._8_4_;
            auVar327._8_4_ = fVar241 * auVar134._8_4_;
            fVar242 = auVar157._12_4_;
            auVar327._12_4_ = fVar242 * auVar134._12_4_;
            auVar71 = vmaxps_avx(auVar272,auVar195);
            auVar273._0_4_ = fVar239 * auVar170._0_4_;
            auVar273._4_4_ = fVar240 * auVar170._4_4_;
            auVar273._8_4_ = fVar241 * auVar170._8_4_;
            auVar273._12_4_ = fVar242 * auVar170._12_4_;
            fVar167 = auVar202._0_4_;
            auVar124._0_4_ = fVar167 * auVar134._0_4_;
            fVar168 = auVar202._4_4_;
            auVar124._4_4_ = fVar168 * auVar134._4_4_;
            fVar169 = auVar202._8_4_;
            auVar124._8_4_ = fVar169 * auVar134._8_4_;
            fVar263 = auVar202._12_4_;
            auVar124._12_4_ = fVar263 * auVar134._12_4_;
            auVar288._0_4_ = fVar167 * auVar170._0_4_;
            auVar288._4_4_ = fVar168 * auVar170._4_4_;
            auVar288._8_4_ = fVar169 * auVar170._8_4_;
            auVar288._12_4_ = fVar263 * auVar170._12_4_;
            auVar142._0_4_ = auVar17._0_4_ + auVar71._0_4_;
            auVar142._4_4_ = auVar17._4_4_ + auVar71._4_4_;
            auVar142._8_4_ = auVar17._8_4_ + auVar71._8_4_;
            auVar142._12_4_ = auVar17._12_4_ + auVar71._12_4_;
            auVar196._8_8_ = 0x3f800000;
            auVar196._0_8_ = 0x3f800000;
            auVar17 = vsubps_avx(auVar196,auVar142);
            auVar71 = vsubps_avx(auVar196,auVar317);
            auVar318._0_4_ = fVar239 * auVar17._0_4_;
            auVar318._4_4_ = fVar240 * auVar17._4_4_;
            auVar318._8_4_ = fVar241 * auVar17._8_4_;
            auVar318._12_4_ = fVar242 * auVar17._12_4_;
            auVar304._0_4_ = fVar239 * auVar71._0_4_;
            auVar304._4_4_ = fVar240 * auVar71._4_4_;
            auVar304._8_4_ = fVar241 * auVar71._8_4_;
            auVar304._12_4_ = fVar242 * auVar71._12_4_;
            auVar143._0_4_ = fVar167 * auVar17._0_4_;
            auVar143._4_4_ = fVar168 * auVar17._4_4_;
            auVar143._8_4_ = fVar169 * auVar17._8_4_;
            auVar143._12_4_ = fVar263 * auVar17._12_4_;
            auVar197._0_4_ = fVar167 * auVar71._0_4_;
            auVar197._4_4_ = fVar168 * auVar71._4_4_;
            auVar197._8_4_ = fVar169 * auVar71._8_4_;
            auVar197._12_4_ = fVar263 * auVar71._12_4_;
            auVar17 = vminps_avx(auVar318,auVar304);
            auVar71 = vminps_avx(auVar143,auVar197);
            auVar17 = vminps_avx(auVar17,auVar71);
            auVar71 = vmaxps_avx(auVar304,auVar318);
            auVar133 = vmaxps_avx(auVar197,auVar143);
            auVar293 = vminps_avx(auVar327,auVar273);
            auVar134 = vminps_avx(auVar124,auVar288);
            auVar293 = vminps_avx(auVar293,auVar134);
            auVar17 = vhaddps_avx(auVar17,auVar293);
            auVar71 = vmaxps_avx(auVar133,auVar71);
            auVar133 = vmaxps_avx(auVar273,auVar327);
            auVar293 = vmaxps_avx(auVar288,auVar124);
            auVar133 = vmaxps_avx(auVar293,auVar133);
            auVar71 = vhaddps_avx(auVar71,auVar133);
            auVar17 = vshufps_avx(auVar17,auVar17,0xe8);
            auVar71 = vshufps_avx(auVar71,auVar71,0xe8);
            auVar289._0_4_ = auVar190._0_4_ + auVar17._0_4_;
            auVar289._4_4_ = auVar190._4_4_ + auVar17._4_4_;
            auVar289._8_4_ = auVar190._8_4_ + auVar17._8_4_;
            auVar289._12_4_ = auVar190._12_4_ + auVar17._12_4_;
            auVar274._0_4_ = auVar190._0_4_ + auVar71._0_4_;
            auVar274._4_4_ = auVar190._4_4_ + auVar71._4_4_;
            auVar274._8_4_ = auVar190._8_4_ + auVar71._8_4_;
            auVar274._12_4_ = auVar190._12_4_ + auVar71._12_4_;
            auVar17 = vmaxps_avx(auVar301,auVar289);
            auVar71 = vminps_avx(auVar274,auVar107);
            auVar17 = vcmpps_avx(auVar71,auVar17,1);
            auVar17 = vshufps_avx(auVar17,auVar17,0x50);
            if ((auVar17 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                -1 < auVar17[0xf]) {
              bVar63 = 0;
              if ((fVar69 < auVar289._0_4_) && (bVar63 = 0, auVar274._0_4_ < auVar107._0_4_)) {
                auVar71 = vmovshdup_avx(auVar289);
                auVar17 = vcmpps_avx(auVar274,auVar107,1);
                bVar63 = auVar17[4] & auVar223._0_4_ < auVar71._0_4_;
              }
              if (((3 < uVar67 || fVar104 < 0.001) | bVar63) != 1) goto LAB_0173a749;
              lVar62 = 200;
              do {
                fVar167 = auVar190._0_4_;
                fVar69 = 1.0 - fVar167;
                fVar104 = fVar69 * fVar69 * fVar69;
                fVar147 = fVar167 * 3.0 * fVar69 * fVar69;
                fVar69 = fVar69 * fVar167 * fVar167 * 3.0;
                auVar180._4_4_ = fVar104;
                auVar180._0_4_ = fVar104;
                auVar180._8_4_ = fVar104;
                auVar180._12_4_ = fVar104;
                auVar144._4_4_ = fVar147;
                auVar144._0_4_ = fVar147;
                auVar144._8_4_ = fVar147;
                auVar144._12_4_ = fVar147;
                auVar125._4_4_ = fVar69;
                auVar125._0_4_ = fVar69;
                auVar125._8_4_ = fVar69;
                auVar125._12_4_ = fVar69;
                fVar167 = fVar167 * fVar167 * fVar167;
                local_650._0_4_ = auVar21._0_4_;
                local_650._4_4_ = auVar21._4_4_;
                fStack_648 = auVar21._8_4_;
                fStack_644 = auVar21._12_4_;
                auVar198._0_4_ = fVar167 * (float)local_650._0_4_;
                auVar198._4_4_ = fVar167 * (float)local_650._4_4_;
                auVar198._8_4_ = fVar167 * fStack_648;
                auVar198._12_4_ = fVar167 * fStack_644;
                auVar16 = vfmadd231ps_fma(auVar198,auVar125,auVar188);
                auVar16 = vfmadd231ps_fma(auVar16,auVar144,auVar20);
                auVar16 = vfmadd231ps_fma(auVar16,auVar19,auVar180);
                auVar126._8_8_ = auVar16._0_8_;
                auVar126._0_8_ = auVar16._0_8_;
                auVar16 = vshufpd_avx(auVar16,auVar16,3);
                auVar17 = vshufps_avx(auVar190,auVar190,0x55);
                auVar16 = vsubps_avx(auVar16,auVar126);
                auVar17 = vfmadd213ps_fma(auVar16,auVar17,auVar126);
                fVar104 = auVar17._0_4_;
                auVar16 = vshufps_avx(auVar17,auVar17,0x55);
                auVar127._0_4_ = fVar146 * fVar104 + fVar145 * auVar16._0_4_;
                auVar127._4_4_ = auVar160._4_4_ * fVar104 + auVar73._4_4_ * auVar16._4_4_;
                auVar127._8_4_ = auVar160._8_4_ * fVar104 + auVar73._8_4_ * auVar16._8_4_;
                auVar127._12_4_ = auVar160._12_4_ * fVar104 + auVar73._12_4_ * auVar16._12_4_;
                auVar190 = vsubps_avx(auVar190,auVar127);
                auVar16 = vandps_avx(local_4c0,auVar17);
                auVar17 = vshufps_avx(auVar16,auVar16,0xf5);
                auVar16 = vmaxss_avx(auVar17,auVar16);
                if (auVar16._0_4_ < fVar103) {
                  local_120 = auVar190._0_4_;
                  if ((local_120 < 0.0) || (1.0 < local_120)) break;
                  auVar16 = vmovshdup_avx(auVar190);
                  fVar104 = auVar16._0_4_;
                  if ((fVar104 < 0.0) || (1.0 < fVar104)) break;
                  auVar17 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar293 = vinsertps_avx(auVar17,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                 [2]),0x28);
                  auVar17 = vdpps_avx(auVar293,local_4d0,0x7f);
                  auVar160 = vdpps_avx(auVar293,local_4e0,0x7f);
                  auVar73 = vdpps_avx(auVar293,local_3c0,0x7f);
                  auVar71 = vdpps_avx(auVar293,local_3d0,0x7f);
                  auVar301 = vdpps_avx(auVar293,local_3e0,0x7f);
                  auVar107 = vdpps_avx(auVar293,local_3f0,0x7f);
                  auVar133 = vdpps_avx(auVar293,local_400,0x7f);
                  auVar293 = vdpps_avx(auVar293,local_410,0x7f);
                  fVar147 = 1.0 - fVar104;
                  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar104 * auVar301._0_4_)),
                                            ZEXT416((uint)fVar147),auVar17);
                  auVar160 = vfmadd231ss_fma(ZEXT416((uint)(auVar107._0_4_ * fVar104)),
                                             ZEXT416((uint)fVar147),auVar160);
                  auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar133._0_4_ * fVar104)),
                                            ZEXT416((uint)fVar147),auVar73);
                  auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar104 * auVar293._0_4_)),
                                            ZEXT416((uint)fVar147),auVar71);
                  fVar145 = 1.0 - local_120;
                  fVar147 = fVar145 * local_120 * local_120 * 3.0;
                  fVar168 = local_120 * local_120 * local_120;
                  auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar168 * auVar71._0_4_)),
                                            ZEXT416((uint)fVar147),auVar73);
                  fVar69 = local_120 * 3.0 * fVar145 * fVar145;
                  auVar160 = vfmadd231ss_fma(auVar73,ZEXT416((uint)fVar69),auVar160);
                  fVar146 = fVar145 * fVar145 * fVar145;
                  auVar17 = vfmadd231ss_fma(auVar160,ZEXT416((uint)fVar146),auVar17);
                  fVar167 = auVar17._0_4_;
                  if (((fVar167 < fVar68) ||
                      (fVar169 = *(float *)(ray + k * 4 + 0x100), fVar169 < fVar167)) ||
                     (pGVar9 = (context->scene->geometries).items[uVar59].ptr,
                     (pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0)) break;
                  auVar17 = vshufps_avx(auVar190,auVar190,0x55);
                  auVar275._8_4_ = 0x3f800000;
                  auVar275._0_8_ = 0x3f8000003f800000;
                  auVar275._12_4_ = 0x3f800000;
                  auVar160 = vsubps_avx(auVar275,auVar17);
                  fVar263 = auVar17._0_4_;
                  auVar290._0_4_ = fVar263 * (float)local_510._0_4_;
                  fVar239 = auVar17._4_4_;
                  auVar290._4_4_ = fVar239 * (float)local_510._4_4_;
                  fVar240 = auVar17._8_4_;
                  auVar290._8_4_ = fVar240 * fStack_508;
                  fVar241 = auVar17._12_4_;
                  auVar290._12_4_ = fVar241 * fStack_504;
                  local_5c0 = auVar23._0_4_;
                  fStack_5bc = auVar23._4_4_;
                  fStack_5b8 = auVar23._8_4_;
                  fStack_5b4 = auVar23._12_4_;
                  auVar296._0_4_ = fVar263 * local_5c0;
                  auVar296._4_4_ = fVar239 * fStack_5bc;
                  auVar296._8_4_ = fVar240 * fStack_5b8;
                  auVar296._12_4_ = fVar241 * fStack_5b4;
                  local_5d0 = auVar135._0_4_;
                  fStack_5cc = auVar135._4_4_;
                  fStack_5c8 = auVar135._8_4_;
                  fStack_5c4 = auVar135._12_4_;
                  auVar305._0_4_ = fVar263 * local_5d0;
                  auVar305._4_4_ = fVar239 * fStack_5cc;
                  auVar305._8_4_ = fVar240 * fStack_5c8;
                  auVar305._12_4_ = fVar241 * fStack_5c4;
                  local_5e0 = auVar150._0_4_;
                  fStack_5dc = auVar150._4_4_;
                  fStack_5d8 = auVar150._8_4_;
                  fStack_5d4 = auVar150._12_4_;
                  auVar256._0_4_ = fVar263 * local_5e0;
                  auVar256._4_4_ = fVar239 * fStack_5dc;
                  auVar256._8_4_ = fVar240 * fStack_5d8;
                  auVar256._12_4_ = fVar241 * fStack_5d4;
                  auVar17 = vfmadd231ps_fma(auVar290,auVar160,local_4f0);
                  auVar73 = vfmadd231ps_fma(auVar296,auVar160,auVar22);
                  auVar71 = vfmadd231ps_fma(auVar305,auVar160,local_500);
                  auVar301 = vfmadd231ps_fma(auVar256,auVar160,auVar115);
                  auVar17 = vsubps_avx(auVar73,auVar17);
                  auVar160 = vsubps_avx(auVar71,auVar73);
                  auVar73 = vsubps_avx(auVar301,auVar71);
                  auVar306._0_4_ = local_120 * auVar160._0_4_;
                  auVar306._4_4_ = local_120 * auVar160._4_4_;
                  auVar306._8_4_ = local_120 * auVar160._8_4_;
                  auVar306._12_4_ = local_120 * auVar160._12_4_;
                  auVar234._4_4_ = fVar145;
                  auVar234._0_4_ = fVar145;
                  auVar234._8_4_ = fVar145;
                  auVar234._12_4_ = fVar145;
                  auVar17 = vfmadd231ps_fma(auVar306,auVar234,auVar17);
                  auVar257._0_4_ = local_120 * auVar73._0_4_;
                  auVar257._4_4_ = local_120 * auVar73._4_4_;
                  auVar257._8_4_ = local_120 * auVar73._8_4_;
                  auVar257._12_4_ = local_120 * auVar73._12_4_;
                  auVar160 = vfmadd231ps_fma(auVar257,auVar234,auVar160);
                  auVar258._0_4_ = local_120 * auVar160._0_4_;
                  auVar258._4_4_ = local_120 * auVar160._4_4_;
                  auVar258._8_4_ = local_120 * auVar160._8_4_;
                  auVar258._12_4_ = local_120 * auVar160._12_4_;
                  auVar160 = vfmadd231ps_fma(auVar258,auVar234,auVar17);
                  auVar218._0_4_ = fVar168 * (float)local_460._0_4_;
                  auVar218._4_4_ = fVar168 * (float)local_460._4_4_;
                  auVar218._8_4_ = fVar168 * fStack_458;
                  auVar218._12_4_ = fVar168 * fStack_454;
                  auVar163._4_4_ = fVar147;
                  auVar163._0_4_ = fVar147;
                  auVar163._8_4_ = fVar147;
                  auVar163._12_4_ = fVar147;
                  auVar17 = vfmadd132ps_fma(auVar163,auVar218,local_450);
                  auVar199._4_4_ = fVar69;
                  auVar199._0_4_ = fVar69;
                  auVar199._8_4_ = fVar69;
                  auVar199._12_4_ = fVar69;
                  auVar17 = vfmadd132ps_fma(auVar199,auVar17,local_440);
                  auVar219._0_4_ = auVar160._0_4_ * 3.0;
                  auVar219._4_4_ = auVar160._4_4_ * 3.0;
                  auVar219._8_4_ = auVar160._8_4_ * 3.0;
                  auVar219._12_4_ = auVar160._12_4_ * 3.0;
                  auVar181._4_4_ = fVar146;
                  auVar181._0_4_ = fVar146;
                  auVar181._8_4_ = fVar146;
                  auVar181._12_4_ = fVar146;
                  auVar160 = vfmadd132ps_fma(auVar181,auVar17,local_430);
                  auVar17 = vshufps_avx(auVar219,auVar219,0xc9);
                  auVar164._0_4_ = auVar160._0_4_ * auVar17._0_4_;
                  auVar164._4_4_ = auVar160._4_4_ * auVar17._4_4_;
                  auVar164._8_4_ = auVar160._8_4_ * auVar17._8_4_;
                  auVar164._12_4_ = auVar160._12_4_ * auVar17._12_4_;
                  auVar17 = vshufps_avx(auVar160,auVar160,0xc9);
                  auVar17 = vfmsub231ps_fma(auVar164,auVar219,auVar17);
                  local_140 = auVar17._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar167;
                    uVar70 = vextractps_avx(auVar17,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar70;
                    uVar70 = vextractps_avx(auVar17,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar70;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                    *(float *)(ray + k * 4 + 0x1e0) = local_120;
                    *(float *)(ray + k * 4 + 0x200) = fVar104;
                    *(uint *)(ray + k * 4 + 0x220) = uVar8;
                    *(uint *)(ray + k * 4 + 0x240) = uVar59;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  local_100 = auVar16._0_8_;
                  auVar16 = vmovshdup_avx(auVar17);
                  local_180 = auVar16._0_8_;
                  auVar16 = vshufps_avx(auVar17,auVar17,0xaa);
                  local_160 = auVar16._0_8_;
                  uStack_178 = local_180;
                  uStack_170 = local_180;
                  uStack_168 = local_180;
                  uStack_158 = local_160;
                  uStack_150 = local_160;
                  uStack_148 = local_160;
                  uStack_13c = local_140;
                  uStack_138 = local_140;
                  uStack_134 = local_140;
                  uStack_130 = local_140;
                  uStack_12c = local_140;
                  uStack_128 = local_140;
                  uStack_124 = local_140;
                  fStack_11c = local_120;
                  fStack_118 = local_120;
                  fStack_114 = local_120;
                  fStack_110 = local_120;
                  fStack_10c = local_120;
                  fStack_108 = local_120;
                  fStack_104 = local_120;
                  uStack_f8 = local_100;
                  uStack_f0 = local_100;
                  uStack_e8 = local_100;
                  local_e0 = CONCAT44(uStack_31c,local_320);
                  uStack_d8 = CONCAT44(uStack_314,uStack_318);
                  uStack_d0 = CONCAT44(uStack_30c,uStack_310);
                  uStack_c8 = CONCAT44(uStack_304,uStack_308);
                  local_c0._4_4_ = uStack_2fc;
                  local_c0._0_4_ = local_300;
                  local_c0._8_4_ = uStack_2f8;
                  local_c0._12_4_ = uStack_2f4;
                  local_c0._16_4_ = uStack_2f0;
                  local_c0._20_4_ = uStack_2ec;
                  local_c0._24_4_ = uStack_2e8;
                  local_c0._28_4_ = uStack_2e4;
                  vpcmpeqd_avx2(local_c0,local_c0);
                  uStack_9c = context->user->instID[0];
                  local_a0 = uStack_9c;
                  uStack_98 = uStack_9c;
                  uStack_94 = uStack_9c;
                  uStack_90 = uStack_9c;
                  uStack_8c = uStack_9c;
                  uStack_88 = uStack_9c;
                  uStack_84 = uStack_9c;
                  uStack_7c = context->user->instPrimID[0];
                  local_80 = uStack_7c;
                  uStack_78 = uStack_7c;
                  uStack_74 = uStack_7c;
                  uStack_70 = uStack_7c;
                  uStack_6c = uStack_7c;
                  uStack_68 = uStack_7c;
                  uStack_64 = uStack_7c;
                  *(float *)(ray + k * 4 + 0x100) = fVar167;
                  local_4a0 = local_340;
                  local_540.valid = (int *)local_4a0;
                  local_540.geometryUserPtr = pGVar9->userPtr;
                  local_540.context = context->user;
                  local_540.hit = (RTCHitN *)&local_180;
                  local_540.N = 8;
                  local_540.ray = (RTCRayN *)ray;
                  if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar9->intersectionFilterN)(&local_540);
                  }
                  auVar98 = vpcmpeqd_avx2(local_4a0,_DAT_01faff00);
                  auVar98 = _DAT_01fe9960 & ~auVar98;
                  if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar98 >> 0x7f,0) != '\0') ||
                        (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar98 >> 0xbf,0) != '\0') ||
                      (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar98[0x1f] < '\0') {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var15)(&local_540);
                    }
                    auVar25 = vpcmpeqd_avx2(local_4a0,_DAT_01faff00);
                    auVar98 = _DAT_01fe9960 & ~auVar25;
                    if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar98 >> 0x7f,0) != '\0') ||
                          (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar98 >> 0xbf,0) != '\0') ||
                        (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar98[0x1f] < '\0') {
                      auVar102._0_8_ = auVar25._0_8_ ^ 0xffffffffffffffff;
                      auVar102._8_4_ = auVar25._8_4_ ^ 0xffffffff;
                      auVar102._12_4_ = auVar25._12_4_ ^ 0xffffffff;
                      auVar102._16_4_ = auVar25._16_4_ ^ 0xffffffff;
                      auVar102._20_4_ = auVar25._20_4_ ^ 0xffffffff;
                      auVar102._24_4_ = auVar25._24_4_ ^ 0xffffffff;
                      auVar102._28_4_ = auVar25._28_4_ ^ 0xffffffff;
                      auVar98 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])local_540.hit);
                      *(undefined1 (*) [32])(local_540.ray + 0x180) = auVar98;
                      auVar98 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_540.hit + 0x20)
                                              );
                      *(undefined1 (*) [32])(local_540.ray + 0x1a0) = auVar98;
                      auVar98 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_540.hit + 0x40)
                                              );
                      *(undefined1 (*) [32])(local_540.ray + 0x1c0) = auVar98;
                      auVar98 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_540.hit + 0x60)
                                              );
                      *(undefined1 (*) [32])(local_540.ray + 0x1e0) = auVar98;
                      auVar98 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_540.hit + 0x80)
                                              );
                      *(undefined1 (*) [32])(local_540.ray + 0x200) = auVar98;
                      auVar98 = vpmaskmovd_avx2(auVar102,*(undefined1 (*) [32])
                                                          (local_540.hit + 0xa0));
                      *(undefined1 (*) [32])(local_540.ray + 0x220) = auVar98;
                      auVar98 = vpmaskmovd_avx2(auVar102,*(undefined1 (*) [32])
                                                          (local_540.hit + 0xc0));
                      *(undefined1 (*) [32])(local_540.ray + 0x240) = auVar98;
                      auVar98 = vpmaskmovd_avx2(auVar102,*(undefined1 (*) [32])
                                                          (local_540.hit + 0xe0));
                      *(undefined1 (*) [32])(local_540.ray + 0x260) = auVar98;
                      auVar98 = vpmaskmovd_avx2(auVar102,*(undefined1 (*) [32])
                                                          (local_540.hit + 0x100));
                      *(undefined1 (*) [32])(local_540.ray + 0x280) = auVar98;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar169;
                  break;
                }
                lVar62 = lVar62 + -1;
              } while (lVar62 != 0);
            }
          }
        }
        else {
          auVar301 = vcmpps_avx(auVar301,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar133 = vcmpps_avx(auVar107,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar301 = vandps_avx(auVar133,auVar301);
          if (-0.0001 < fVar145 && (auVar301 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_01739abd;
        }
        if (uVar67 == 0) break;
      } while( true );
    }
    uVar70 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar97._4_4_ = uVar70;
    auVar97._0_4_ = uVar70;
    auVar97._8_4_ = uVar70;
    auVar97._12_4_ = uVar70;
    auVar16 = vcmpps_avx(local_470,auVar97,2);
    uVar59 = vmovmskps_avx(auVar16);
    uVar57 = uVar57 & local_568 & uVar59;
    if (uVar57 == 0) {
      return;
    }
  } while( true );
LAB_0173a749:
  auVar16 = vinsertps_avx(auVar16,ZEXT416((uint)fVar147),0x10);
  auVar297 = ZEXT1664(auVar16);
  auVar16 = vinsertps_avx(auVar223,ZEXT416((uint)auVar224._0_4_),0x10);
  auVar201 = ZEXT1664(auVar16);
  goto LAB_017391f9;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }